

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264d_init.c
# Opt level: O1

MPP_RET init_picture(H264_SLICE_t *currSlice)

{
  RK_S32 *pRVar1;
  RK_S32 *pRVar2;
  RK_U8 *pRVar3;
  RK_U8 *list_size;
  RK_U32 *pRVar4;
  undefined8 *puVar5;
  RK_S32 RVar6;
  RK_S32 RVar7;
  RK_U32 RVar8;
  H264dVideoCtx_t *p_Vid_00;
  h264_dec_ctx_t *phVar9;
  h264_sps_t *phVar10;
  h264_dpb_buf_t *phVar11;
  h264_sps_t *phVar12;
  h264_store_pic_t *phVar13;
  H264dVideoCtx_t *pHVar14;
  h264_dpb_buf_t *phVar15;
  MppFrame pvVar16;
  h264d_video_ctx_t *phVar17;
  h264_frame_store_t *phVar18;
  H264_FrameStore_t *pHVar19;
  h264_store_pic_t **pphVar20;
  h264d_cur_ctx_t *phVar21;
  h264_sei_t *phVar22;
  h264_dec_ctx_t *phVar23;
  h264_refpic_info_t *phVar24;
  h264_dpb_mark_t *phVar25;
  H264_DecCtx_t *pHVar26;
  h264d_dxva_ctx_t *phVar27;
  h264_dpb_info_t *phVar28;
  ushort uVar29;
  ushort uVar30;
  MPP_RET MVar31;
  MPP_RET MVar32;
  RK_U32 RVar33;
  H264_StorePic_t *p;
  H264_StorePic_t *p_00;
  H264_FrameStore_t **ppHVar34;
  H264_FrameStore_t **ppHVar35;
  H264_FrameStore_t **fs_list;
  h264_frame_store_t **pphVar36;
  h264_store_pic_t *phVar37;
  MppBuffer buffer;
  uint uVar38;
  RK_S32 RVar39;
  int iVar40;
  undefined4 uVar41;
  ulong uVar42;
  int iVar43;
  char *pcVar44;
  RK_S32 *pRVar45;
  long lVar46;
  uint uVar47;
  RK_S32 *pRVar48;
  long lVar49;
  ulong uVar50;
  long lVar51;
  uint uVar52;
  undefined8 uVar53;
  ulong uVar54;
  h264_dpb_info_t *phVar55;
  int iVar56;
  byte bVar57;
  int iVar58;
  MppFrameFormat MVar59;
  MppFrameFormat MVar60;
  MppFrameFormat MVar61;
  h264_dpb_mark_t *phVar62;
  size_t sVar63;
  ulong uVar64;
  uint uVar65;
  H264dVideoCtx_t *p_Vid;
  bool bVar66;
  MppFrame local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  p_Vid_00 = currSlice->p_Vid;
  phVar9 = p_Vid_00->p_Dec;
  RVar33 = (phVar9->errctx).i_slice_no;
  if ((((RVar33 == 0) && ((p_Vid_00->recovery).valid_flag != 0)) &&
      ((p_Vid_00->recovery).first_frm_valid != 0)) &&
     ((p_Vid_00->recovery).first_frm_id == currSlice->frame_num)) {
    uVar38 = (uint)(currSlice->layer_id == 0);
  }
  else {
    uVar38 = 0;
    if (currSlice->layer_id == 0) {
      uVar38 = (uint)(currSlice->slice_type == 2);
    }
    uVar38 = uVar38 + RVar33;
  }
  (phVar9->errctx).i_slice_no = uVar38;
  if (uVar38 == 0) {
    if ((h264d_debug & 4) == 0) {
      return MPP_NOK;
    }
    _mpp_log_l(4,"h264d_init","[Discard] Discard slice before I Slice. \n",(char *)0x0);
    return MPP_NOK;
  }
  phVar10 = p_Vid_00->active_sps;
  phVar11 = currSlice->p_Dpb;
  p = alloc_storable_picture(p_Vid_00,currSlice->structure);
  if (p == (H264_StorePic_t *)0x0) {
    MVar31 = MPP_ERR_MALLOC;
    if ((h264d_debug & 1) == 0) goto LAB_0019798c;
    pcVar44 = "malloc buffer error(%d).\n";
    MVar31 = MPP_ERR_MALLOC;
LAB_00197549:
    _mpp_log_l(4,"h264d_init",pcVar44,(char *)0x0);
LAB_0019798c:
    mpp_mem_pool_put_f("alloc_decpic",p_Vid_00->pic_st,p);
    p = (h264_store_pic_t *)0x0;
  }
  else {
    iVar43 = currSlice->layer_id;
    RVar39 = p_Vid_00->last_toppoc[iVar43];
    pRVar45 = &currSlice->toppoc;
    currSlice->toppoc = RVar39;
    pRVar1 = &currSlice->bottompoc;
    currSlice->bottompoc = p_Vid_00->last_bottompoc[iVar43];
    currSlice->framepoc = p_Vid_00->last_framepoc[iVar43];
    currSlice->ThisPOC = p_Vid_00->last_thispoc[iVar43];
    phVar12 = p_Vid_00->active_sps;
    uVar38 = 1 << ((char)phVar12->log2_max_pic_order_cnt_lsb_minus4 + 4U & 0x1f);
    pRVar2 = &currSlice->framepoc;
    iVar43 = phVar12->pic_order_cnt_type;
    bVar66 = true;
    if (iVar43 == 2) {
      if (currSlice->idr_flag == 0) {
        if (p_Vid_00->last_has_mmco_5 != 0) {
          p_Vid_00->PreviousFrameNum = 0;
          p_Vid_00->PreviousFrameNumOffset = 0;
        }
        iVar43 = currSlice->frame_num;
        RVar33 = p_Vid_00->PreviousFrameNumOffset;
        if (iVar43 < (int)p_Vid_00->PreviousFrameNum) {
          RVar33 = RVar33 + p_Vid_00->max_frame_num;
        }
        p_Vid_00->FrameNumOffset = RVar33;
        RVar33 = iVar43 + RVar33;
        currSlice->AbsFrameNum = RVar33;
        iVar43 = RVar33 * 2 - (uint)(currSlice->nal_reference_idc == 0);
        currSlice->ThisPOC = iVar43;
        if (currSlice->field_pic_flag == 0) {
          *pRVar2 = iVar43;
          *pRVar1 = iVar43;
        }
        else {
          currSlice->framepoc = iVar43;
          if (currSlice->bottom_field_flag != 0) {
            *pRVar1 = iVar43;
            goto LAB_00197932;
          }
        }
        *pRVar45 = iVar43;
      }
      else {
        p_Vid_00->FrameNumOffset = 0;
        currSlice->ThisPOC = 0;
        currSlice->toppoc = 0;
        currSlice->bottompoc = 0;
        currSlice->framepoc = 0;
        if (currSlice->frame_num != 0) {
          MVar31 = MPP_ERR_VALUE;
          if ((h264d_debug & 4) != 0) {
            uVar53 = 0xa1;
LAB_00197610:
            MVar31 = MPP_ERR_VALUE;
            _mpp_log_l(4,"h264d_init","value error(%d).\n",(char *)0x0,uVar53);
          }
          goto LAB_00197952;
        }
      }
LAB_00197932:
      p_Vid_00->PreviousFrameNum = currSlice->frame_num;
      p_Vid_00->PreviousFrameNumOffset = p_Vid_00->FrameNumOffset;
LAB_0019794d:
      bVar66 = false;
      MVar31 = MPP_OK;
    }
    else {
      if (iVar43 == 1) {
        if (currSlice->idr_flag == 0) {
          if (p_Vid_00->last_has_mmco_5 != 0) {
            p_Vid_00->PreviousFrameNumOffset = 0;
            p_Vid_00->PreviousFrameNum = 0;
          }
          RVar33 = p_Vid_00->PreviousFrameNumOffset;
          if (currSlice->frame_num < (int)p_Vid_00->PreviousFrameNum) {
            RVar33 = RVar33 + p_Vid_00->max_frame_num;
          }
          p_Vid_00->FrameNumOffset = RVar33;
        }
        else {
          p_Vid_00->FrameNumOffset = 0;
          if (currSlice->frame_num != 0) {
            MVar31 = MPP_ERR_VALUE;
            if ((h264d_debug & 4) != 0) {
              uVar53 = 0x62;
              goto LAB_00197610;
            }
            goto LAB_00197952;
          }
        }
        uVar38 = phVar12->num_ref_frames_in_pic_order_cnt_cycle;
        uVar50 = (ulong)uVar38;
        if (uVar50 == 0) {
          RVar33 = 0;
        }
        else {
          RVar33 = currSlice->frame_num + p_Vid_00->FrameNumOffset;
        }
        currSlice->AbsFrameNum = RVar33;
        iVar43 = currSlice->nal_reference_idc;
        if ((iVar43 == 0) && (currSlice->AbsFrameNum != 0)) {
          currSlice->AbsFrameNum = currSlice->AbsFrameNum - 1;
        }
        p_Vid_00->ExpectedDeltaPerPicOrderCntCycle = 0;
        if (0 < (int)uVar38) {
          uVar54 = 0;
          iVar56 = 0;
          do {
            iVar56 = iVar56 + phVar12->offset_for_ref_frame[uVar54];
            p_Vid_00->ExpectedDeltaPerPicOrderCntCycle = iVar56;
            uVar54 = uVar54 + 1;
          } while (uVar50 != uVar54);
        }
        if (currSlice->AbsFrameNum == 0) {
          p_Vid_00->ExpectedPicOrderCnt = 0;
        }
        else {
          uVar65 = currSlice->AbsFrameNum - 1;
          uVar38 = uVar65 / uVar38;
          uVar50 = (ulong)uVar65 % uVar50;
          p_Vid_00->PicOrderCntCycleCnt = uVar38;
          iVar40 = (int)uVar50;
          p_Vid_00->FrameNumInPicOrderCntCycle = iVar40;
          iVar56 = uVar38 * p_Vid_00->ExpectedDeltaPerPicOrderCntCycle;
          p_Vid_00->ExpectedPicOrderCnt = iVar56;
          if (-1 < iVar40) {
            uVar54 = 0xffffffffffffffff;
            do {
              iVar56 = iVar56 + phVar12->offset_for_ref_frame[uVar54 + 1];
              p_Vid_00->ExpectedPicOrderCnt = iVar56;
              uVar54 = uVar54 + 1;
            } while (uVar54 < uVar50);
          }
        }
        if (iVar43 == 0) {
          p_Vid_00->ExpectedPicOrderCnt =
               p_Vid_00->ExpectedPicOrderCnt + phVar12->offset_for_non_ref_pic;
        }
        if (currSlice->field_pic_flag == 0) {
          iVar56 = currSlice->delta_pic_order_cnt[0] + p_Vid_00->ExpectedPicOrderCnt;
          currSlice->toppoc = iVar56;
          iVar43 = phVar12->offset_for_top_to_bottom_field + iVar56 +
                   currSlice->delta_pic_order_cnt[1];
          currSlice->bottompoc = iVar43;
          if (iVar56 < iVar43) {
            iVar43 = iVar56;
          }
          currSlice->framepoc = iVar43;
        }
        else if (currSlice->bottom_field_flag == 0) {
          iVar43 = p_Vid_00->ExpectedPicOrderCnt + currSlice->delta_pic_order_cnt[0];
          currSlice->toppoc = iVar43;
        }
        else {
          iVar43 = p_Vid_00->ExpectedPicOrderCnt + phVar12->offset_for_top_to_bottom_field +
                   currSlice->delta_pic_order_cnt[0];
          currSlice->bottompoc = iVar43;
        }
        currSlice->ThisPOC = iVar43;
        currSlice->framepoc = iVar43;
        goto LAB_00197932;
      }
      MVar31 = MPP_NOK;
      if (iVar43 == 0) {
        if (currSlice->idr_flag == 0) {
          if (p_Vid_00->last_has_mmco_5 != 0) {
            p_Vid_00->PrevPicOrderCntMsb = 0;
            if (p_Vid_00->last_pic_bottom_field == 0) {
              p_Vid_00->PrevPicOrderCntLsb = RVar39;
            }
            else {
              p_Vid_00->PrevPicOrderCntLsb = 0;
            }
          }
        }
        else {
          p_Vid_00->PrevPicOrderCntMsb = 0;
          p_Vid_00->PrevPicOrderCntLsb = 0;
        }
        iVar43 = currSlice->pic_order_cnt_lsb;
        iVar56 = p_Vid_00->PrevPicOrderCntLsb;
        if ((iVar43 < iVar56) && ((int)(uVar38 >> 1) <= iVar56 - iVar43)) {
          RVar39 = uVar38 + p_Vid_00->PrevPicOrderCntMsb;
        }
        else if ((iVar56 < iVar43) && ((int)(uVar38 >> 1) < iVar43 - iVar56)) {
          RVar39 = p_Vid_00->PrevPicOrderCntMsb - uVar38;
        }
        else {
          RVar39 = p_Vid_00->PrevPicOrderCntMsb;
        }
        currSlice->PicOrderCntMsb = RVar39;
        if (currSlice->field_pic_flag == 0) {
          iVar40 = currSlice->PicOrderCntMsb + iVar43;
          currSlice->toppoc = iVar40;
          iVar56 = currSlice->delta_pic_order_cnt_bottom + iVar40;
          currSlice->bottompoc = iVar56;
          if (currSlice->delta_pic_order_cnt_bottom < 1) {
            iVar40 = iVar56;
          }
          currSlice->framepoc = iVar40;
        }
        else {
          iVar40 = currSlice->PicOrderCntMsb + iVar43;
          if (currSlice->bottom_field_flag == 0) {
            *pRVar45 = iVar40;
          }
          else {
            *pRVar1 = iVar40;
          }
        }
        currSlice->ThisPOC = iVar40;
        currSlice->framepoc = iVar40;
        p_Vid_00->ThisPOC = iVar40;
        p_Vid_00->PreviousFrameNum = currSlice->frame_num;
        if (currSlice->nal_reference_idc != 0) {
          p_Vid_00->PrevPicOrderCntLsb = iVar43;
          p_Vid_00->PrevPicOrderCntMsb = currSlice->PicOrderCntMsb;
        }
        goto LAB_0019794d;
      }
    }
LAB_00197952:
    if (bVar66) {
      if ((h264d_debug & 4) != 0) {
        _mpp_log_l(4,"h264d_init","Function error(%d).\n",(char *)0x0);
      }
      goto LAB_0019798c;
    }
    RVar39 = currSlice->toppoc;
    p->top_poc = RVar39;
    p->bottom_poc = currSlice->bottompoc;
    p->frame_poc = currSlice->framepoc;
    p->ThisPOC = currSlice->ThisPOC;
    p_Vid_00->last_toppoc[currSlice->layer_id] = RVar39;
    p_Vid_00->last_bottompoc[currSlice->layer_id] = currSlice->bottompoc;
    p_Vid_00->last_framepoc[currSlice->layer_id] = currSlice->framepoc;
    p_Vid_00->last_thispoc[currSlice->layer_id] = currSlice->ThisPOC;
    iVar43 = currSlice->structure;
    if (iVar43 == 3) {
      if (currSlice->mb_aff_frame_flag == 0) {
        p->iCodingType = 0;
      }
      else {
        p->iCodingType = 3;
      }
    }
    else {
      p->iCodingType = 1;
    }
    iVar56 = currSlice->layer_id;
    p->layer_id = iVar56;
    p->view_id = currSlice->view_id;
    p->inter_view_flag = currSlice->inter_view_flag;
    p->anchor_pic_flag = currSlice->anchor_pic_flag;
    if ((iVar56 == 1) && ((p_Vid_00->profile_idc == 0x80 || (p_Vid_00->profile_idc == 0x76)))) {
      pHVar14 = currSlice->p_Vid;
      phVar15 = pHVar14->p_Dpb_layer[0];
      uVar50 = (ulong)phVar15->used_size;
      if (iVar43 == 3) {
        RVar39 = 0;
        if (uVar50 == 0) goto LAB_00197dc1;
        uVar54 = 0;
        phVar37 = (h264_store_pic_t *)0x0;
        do {
          phVar13 = phVar15->fs[uVar54]->frame;
          if (phVar13 != (h264_store_pic_t *)0x0) {
            pRVar48 = &phVar13->poc_mmco5;
            if (phVar13->is_mmco_5 == '\0') {
              pRVar48 = &phVar13->poc;
            }
            RVar39 = *pRVar48;
          }
        } while (((((phVar13 == (h264_store_pic_t *)0x0) || (phVar13->layer_id != 0)) ||
                  (RVar39 != *pRVar2)) || (phVar37 = phVar13, phVar13->is_mmco_5 != '\0')) &&
                (uVar54 = uVar54 + 1, uVar50 != uVar54));
      }
      else {
        RVar39 = 0;
        if (iVar43 == 1) {
          if (uVar50 == 0) {
LAB_00197dc1:
            phVar37 = (h264_store_pic_t *)0x0;
          }
          else {
            uVar54 = 0;
            phVar37 = (h264_store_pic_t *)0x0;
            do {
              phVar13 = phVar15->fs[uVar54]->top_field;
              if (phVar13 != (h264_store_pic_t *)0x0) {
                pRVar48 = &phVar13->top_poc_mmco5;
                if (phVar13->is_mmco_5 == '\0') {
                  pRVar48 = &phVar13->top_poc;
                }
                RVar39 = *pRVar48;
              }
            } while ((((phVar13 == (h264_store_pic_t *)0x0) || (phVar13->layer_id != 0)) ||
                     ((RVar39 != *pRVar45 || (phVar37 = phVar13, phVar13->is_mmco_5 != '\0')))) &&
                    (uVar54 = uVar54 + 1, uVar50 != uVar54));
          }
        }
        else {
          if (uVar50 == 0) goto LAB_00197dc1;
          uVar54 = 0;
          phVar37 = (h264_store_pic_t *)0x0;
          do {
            phVar13 = phVar15->fs[uVar54]->bottom_field;
            if (phVar13 != (h264_store_pic_t *)0x0) {
              pRVar48 = &phVar13->bot_poc_mmco5;
              if (phVar13->is_mmco_5 == '\0') {
                pRVar48 = &phVar13->bottom_poc;
              }
              RVar39 = *pRVar48;
            }
          } while ((((phVar13 == (h264_store_pic_t *)0x0) || (phVar13->layer_id != 0)) ||
                   ((RVar39 != *pRVar1 || (phVar37 = phVar13, phVar13->is_mmco_5 != '\0')))) &&
                  (uVar54 = uVar54 + 1, uVar50 != uVar54));
        }
      }
      if (phVar37 == (h264_store_pic_t *)0x0) {
        MVar31 = MPP_OK;
      }
      else {
        p_00 = alloc_storable_picture(pHVar14,pHVar14->structure);
        if (p_00 == (H264_StorePic_t *)0x0) {
          if ((h264d_debug & 1) == 0) {
            p_00 = (H264_StorePic_t *)0x0;
          }
          else {
            p_00 = (H264_StorePic_t *)0x0;
            _mpp_log_l(4,"h264d_init","malloc buffer error(%d).\n",(char *)0x0,0x104);
          }
        }
        else {
          p_00->mem_malloc_type = Mem_Clone;
          phVar25 = phVar37->mem_mark;
          p_00->mem_mark = phVar25;
          uVar38 = p_00->structure;
          if ((uVar38 & 0xfffffffd) == 1) {
            phVar25->top_used = phVar25->top_used + '\x01';
          }
          if ((uVar38 & 0xfffffffe) == 2) {
            phVar25->bot_used = phVar25->bot_used + '\x01';
          }
          p_00->colmv_no_used_flag = '\x01';
          p_00->pic_num = phVar37->pic_num;
          p_00->frame_num = phVar37->frame_num;
          p_00->long_term_frame_idx = phVar37->long_term_frame_idx;
          p_00->long_term_pic_num = phVar37->long_term_pic_num;
          p_00->is_long_term = '\0';
          p_00->non_existing = phVar37->non_existing;
          p_00->max_slice_id = phVar37->max_slice_id;
          p_00->structure = phVar37->structure;
          p_00->mb_aff_frame_flag = phVar37->mb_aff_frame_flag;
          p_00->poc = phVar37->poc;
          p_00->top_poc = phVar37->top_poc;
          p_00->bottom_poc = phVar37->bottom_poc;
          p_00->frame_poc = phVar37->frame_poc;
          p_00->is_mmco_5 = phVar37->is_mmco_5;
          p_00->poc_mmco5 = phVar37->poc_mmco5;
          p_00->top_poc_mmco5 = phVar37->top_poc_mmco5;
          p_00->bot_poc_mmco5 = phVar37->bot_poc_mmco5;
          p_00->pic_num = phVar37->pic_num;
          p_00->frame_num = phVar37->frame_num;
          p_00->slice_type = phVar37->slice_type;
          p_00->idr_flag = phVar37->idr_flag;
          p_00->no_output_of_prior_pics_flag = phVar37->no_output_of_prior_pics_flag;
          p_00->long_term_reference_flag = 0;
          p_00->adaptive_ref_pic_buffering_flag = 0;
          p_00->dec_ref_pic_marking_buffer = (h264_drpm_t *)0x0;
          p_00->PicWidthInMbs = phVar37->PicWidthInMbs;
          p_00->chroma_format_idc = phVar37->chroma_format_idc;
          p_00->frame_mbs_only_flag = phVar37->frame_mbs_only_flag;
          iVar43 = phVar37->frame_cropping_flag;
          p_00->frame_cropping_flag = iVar43;
          if (iVar43 != 0) {
            p_00->frame_crop_left_offset = phVar37->frame_crop_left_offset;
            p_00->frame_crop_right_offset = phVar37->frame_crop_right_offset;
            p_00->frame_crop_top_offset = phVar37->frame_crop_top_offset;
            p_00->frame_crop_bottom_offset = phVar37->frame_crop_bottom_offset;
          }
          p_00->inter_view_flag = phVar37->inter_view_flag;
          p_00->anchor_pic_flag = 0;
          p_00->view_id = phVar37->view_id;
          p_00->layer_id = phVar37->layer_id;
          p_00->proc_flag = 1;
          p_00->used_for_reference = 1;
          p_00->is_output = 1;
        }
        if (p_00 == (H264_StorePic_t *)0x0) {
          if ((h264d_debug & 1) != 0) {
            _mpp_log_l(4,"h264d_init","malloc buffer error(%d).\n",(char *)0x0,0x174);
          }
          MVar31 = MPP_ERR_MALLOC;
        }
        else {
          phVar15 = currSlice->p_Dpb;
          pHVar14 = phVar15->p_Vid;
          pHVar19 = *phVar15->fs_ilref;
          if (phVar15->used_size_il != 0) {
            pHVar26 = pHVar14->p_Dec;
            if (pHVar19->frame != (H264_StorePic_t *)0x0) {
              free_storable_picture(pHVar26,pHVar19->frame);
              pHVar19->frame = (h264_store_pic_t *)0x0;
            }
            if (pHVar19->top_field != (H264_StorePic_t *)0x0) {
              free_storable_picture(pHVar26,pHVar19->top_field);
              pHVar19->top_field = (h264_store_pic_t *)0x0;
            }
            if (pHVar19->bottom_field != (H264_StorePic_t *)0x0) {
              free_storable_picture(pHVar26,pHVar19->bottom_field);
              pHVar19->bottom_field = (h264_store_pic_t *)0x0;
            }
            pHVar19->is_used = 0;
            pHVar19->is_reference = 0;
            phVar15->used_size_il = phVar15->used_size_il - 1;
          }
          if (pHVar19->is_used < 1) {
LAB_00198211:
            MVar32 = insert_picture_in_dpb(pHVar14,pHVar19,p_00,'\0');
            if (MVar32 < MPP_OK) {
              if ((h264d_debug & 4) != 0) {
                _mpp_log_l(4,"h264d_init","Function error(%d).\n",(char *)0x0,0xe9);
              }
            }
            else {
              iVar43 = pHVar19->is_used;
              if (p_00->structure == 3) {
                bVar66 = iVar43 == 3;
              }
              else {
                bVar66 = iVar43 < 3 && iVar43 != 0;
              }
              if (bVar66) {
                phVar15->used_size_il = phVar15->used_size_il + 1;
              }
              MVar32 = MPP_OK;
            }
          }
          else {
            iVar43 = p_00->structure;
            if (iVar43 == 1) {
              if (pHVar19->top_field != (h264_store_pic_t *)0x0) {
                MVar32 = MPP_ERR_VALUE;
                if ((h264d_debug & 4) != 0) {
                  uVar53 = 0xe4;
                  goto LAB_00198203;
                }
                goto LAB_001982bc;
              }
              goto LAB_00198211;
            }
            if (iVar43 == 2) {
              if (pHVar19->bottom_field == (h264_store_pic_t *)0x0) goto LAB_00198211;
              MVar32 = MPP_ERR_VALUE;
              if ((h264d_debug & 4) != 0) {
                uVar53 = 0xe6;
                goto LAB_00198203;
              }
            }
            else {
              if ((iVar43 != 3) || (pHVar19->frame == (h264_store_pic_t *)0x0)) goto LAB_00198211;
              MVar32 = MPP_ERR_VALUE;
              if ((h264d_debug & 4) != 0) {
                uVar53 = 0xe2;
LAB_00198203:
                _mpp_log_l(4,"h264d_init","value error(%d).\n",(char *)0x0,uVar53);
                MVar32 = MPP_ERR_VALUE;
              }
            }
          }
LAB_001982bc:
          MVar31 = MPP_OK;
          if ((MVar32 < MPP_OK) && (MVar31 = MVar32, (h264d_debug & 4) != 0)) {
            _mpp_log_l(4,"h264d_init","Function error(%d).\n",(char *)0x0,0x175);
          }
        }
      }
      if (MVar31 < MPP_OK) {
        if ((h264d_debug & 4) != 0) {
          pcVar44 = "Function error(%d).\n";
          goto LAB_00197549;
        }
        goto LAB_0019798c;
      }
    }
    iVar43 = currSlice->structure;
    if (((iVar43 != 1) && (pRVar45 = pRVar2, iVar43 != 3)) &&
       (MVar31 = MPP_NOK, pRVar45 = pRVar1, iVar43 != 2)) goto LAB_0019798c;
    p->poc = *pRVar45;
    p->slice_type = p_Vid_00->type;
    p->used_for_reference = (uint)(currSlice->nal_reference_idc != 0);
    p->idr_flag = currSlice->idr_flag;
    p->no_output_of_prior_pics_flag = currSlice->no_output_of_prior_pics_flag;
    p->long_term_reference_flag = currSlice->long_term_reference_flag;
    p->adaptive_ref_pic_buffering_flag = currSlice->adaptive_ref_pic_buffering_flag;
    p->dec_ref_pic_marking_buffer = currSlice->dec_ref_pic_marking_buffer;
    currSlice->dec_ref_pic_marking_buffer = (h264_drpm_t *)0x0;
    p->mb_aff_frame_flag = currSlice->mb_aff_frame_flag;
    p->PicWidthInMbs = p_Vid_00->PicWidthInMbs;
    RVar33 = currSlice->frame_num;
    p->pic_num = RVar33;
    p->frame_num = RVar33;
    p->chroma_format_idc = phVar10->chroma_format_idc;
    p->frame_mbs_only_flag = phVar10->frame_mbs_only_flag;
    iVar43 = phVar10->frame_cropping_flag;
    p->frame_cropping_flag = iVar43;
    if (iVar43 == 0) {
      p->frame_crop_left_offset = 0;
      p->frame_crop_right_offset = 0;
      p->frame_crop_top_offset = 0;
      p->frame_crop_bottom_offset = 0;
    }
    else {
      p->frame_crop_left_offset = phVar10->frame_crop_left_offset;
      p->frame_crop_right_offset = phVar10->frame_crop_right_offset;
      p->frame_crop_top_offset = phVar10->frame_crop_top_offset;
      p->frame_crop_bottom_offset = phVar10->frame_crop_bottom_offset;
    }
    p->width = p_Vid_00->width;
    p->height = p_Vid_00->height;
    p->width_after_crop = p_Vid_00->width_after_crop;
    p->height_after_crop = p_Vid_00->height_after_crop;
    RVar33 = get_field_dpb_combine_flag(phVar11->last_picture,p);
    p->combine_flag = RVar33;
    phVar23 = p_Vid_00->p_Dec;
    uVar38 = p->structure;
    lVar51 = (long)p->layer_id;
    if (RVar33 == 0) {
      phVar25 = phVar23->dpb_mark;
      bVar57 = 1;
      while (((phVar25[(byte)(bVar57 - 1)].out_flag != '\0' ||
              (phVar62 = phVar25 + (byte)(bVar57 - 1), phVar62->top_used != '\0')) ||
             (phVar62->bot_used != '\0'))) {
        if (((0x22 < bVar57) && ((h264d_debug & 2) != 0)) &&
           (_mpp_log_l(2,"h264d_init","Assertion %s failed at %s:%d\n",(char *)0x0,"35 > idx",
                       "dpb_mark_malloc",0x195), (mpp_debug._3_1_ & 0x10) != 0)) goto LAB_0019af2f;
        bVar57 = bVar57 + 1;
      }
      mpp_buf_slot_get_unused(p_Vid_00->p_Dec->frame_slots,&phVar62->slot_idx);
      if (phVar62->slot_idx < 0) {
        MVar31 = 0xc;
        MVar32 = MPP_NOK;
        if ((h264d_debug & 4) != 0) {
          _mpp_log_l(4,"h264d_init","[dpb_mark_malloc] error, buf_slot has not get.",(char *)0x0);
        }
      }
      else {
        phVar62->out_flag = '\x01';
        pvVar16 = phVar23->curframe;
        MVar59 = (phVar23->cfg->base).out_fmt;
        iVar43 = p_Vid_00->yuv_format;
        if (iVar43 == 2) {
          if (p_Vid_00->bit_depth_luma == 10) {
            mpp_slots_set_prop(phVar23->frame_slots,SLOTS_LEN_ALIGN,rkv_len_align_422);
            MVar60 = MPP_FMT_YUV422SP_10BIT;
          }
          else {
            MVar60 = MPP_FMT_YUV_BUTT;
            if (p_Vid_00->bit_depth_luma == 8) {
              mpp_slots_set_prop(phVar23->frame_slots,SLOTS_LEN_ALIGN,rkv_len_align_422);
              MVar60 = MPP_FMT_YUV422SP;
            }
          }
        }
        else if (iVar43 == 1) {
          if (p_Vid_00->bit_depth_luma == 8) {
            MVar60 = MPP_FMT_YUV420SP;
          }
          else {
            if (p_Vid_00->bit_depth_luma != 10) goto LAB_0019975b;
            MVar60 = MPP_FMT_YUV420SP_10BIT;
          }
        }
        else if ((iVar43 != 0) || (MVar60 = MPP_FMT_YUV400, p_Vid_00->bit_depth_luma != 8)) {
LAB_0019975b:
          MVar60 = MPP_FMT_YUV_BUTT;
        }
        MVar61 = MVar59 & 0xf00000;
        if (MVar61 == MPP_FMT_YUV420SP) {
          if ((MVar59 >> 0x19 & 1) != 0) {
            MVar59 = MVar60 | 0x2000000;
            goto LAB_00199827;
          }
        }
        else {
          MVar59 = MVar60;
          if (((p_Vid_00->frame_mbs_only_flag != 0) || (9 < p_Vid_00->bit_depth_luma)) &&
             ((((phVar23->cfg->base).enable_vproc & 2) == 0 ||
              (((0x780 < p_Vid_00->width || (0x440 < p_Vid_00->height)) ||
               (p_Vid_00->bit_depth_luma != 8)))))) {
            mpp_slots_set_prop(phVar23->frame_slots,SLOTS_HOR_ALIGN,hor_align_64);
            MVar59 = MVar60 | MVar61;
          }
LAB_00199827:
          (phVar23->cfg->base).out_fmt = MVar59;
          MVar60 = MVar59;
        }
        *(MppFrameFormat *)((long)pvVar16 + 0x68) = MVar60;
        RVar33 = p_Vid_00->bit_depth_luma;
        iVar43 = p_Vid_00->width;
        iVar56 = p_Vid_00->height;
        *(RK_U32 *)((long)pvVar16 + 0x10) = RVar33 * iVar43 + 7 >> 3;
        *(int *)((long)pvVar16 + 0x14) = iVar56;
        RVar8 = p_Vid_00->width_after_crop;
        *(RK_U32 *)((long)pvVar16 + 8) = RVar8;
        *(RK_U32 *)((long)pvVar16 + 0xc) = p_Vid_00->height_after_crop;
        phVar21 = p_Vid_00->p_Cur;
        *(RK_S64 *)((long)pvVar16 + 0x38) = phVar21->last_pts;
        *(RK_S64 *)((long)pvVar16 + 0x40) = phVar21->last_dts;
        if ((MVar59 & 0xf00000) != MPP_FMT_YUV420SP) {
          *(undefined8 *)((long)pvVar16 + 0x20) = 0x400000000;
          if (*compat_ext_fbc_buf_size != 0) {
            *(int *)((long)pvVar16 + 0x14) = iVar56 + 0x10;
          }
          *(RK_U32 *)((long)pvVar16 + 0x1c) = RVar8 + 0x3f & 0xffffffc0;
          if (*compat_ext_fbc_hdr_256_odd != 0) {
            *(RK_U32 *)((long)pvVar16 + 0x1c) = RVar8 + 0xff & 0xfffffe00 | 0x100;
          }
        }
        if (uVar38 == 1) {
          *(undefined4 *)((long)pvVar16 + 0x28) = 7;
        }
        else if (uVar38 == 2) {
          *(undefined4 *)((long)pvVar16 + 0x28) = 0xb;
        }
        else if (uVar38 == 3) {
          *(undefined4 *)((long)pvVar16 + 0x28) = 0;
          if (((RVar33 == 8 && (iVar56 < 0x441 && iVar43 < 0x781)) &
              (byte)(phVar23->cfg->base).enable_vproc >> 1) == 1) {
            *(undefined4 *)((long)pvVar16 + 0x28) = 0xc;
          }
        }
        else {
          if ((h264d_debug & 0x20000) != 0) {
            _mpp_log_l(4,"h264d_init","Unknown interlace mode",(char *)0x0);
          }
          _mpp_log_l(2,"h264d_init","Assertion %s failed at %s:%d\n",(char *)0x0,"0",
                     "dpb_mark_malloc",0x1fb);
          if ((mpp_debug._3_1_ & 0x10) != 0) goto LAB_0019af2f;
        }
        if (((phVar23->svc_valid != '\0') && ((phVar23->p_Cur->slice).svcExt.valid != 0)) &&
           (*(MppMeta *)((long)pvVar16 + 0xb0) != (MppMeta)0x0)) {
          mpp_meta_set_s32(*(MppMeta *)((long)pvVar16 + 0xb0),KEY_TEMPORAL_ID,
                           (phVar23->p_Cur->slice).svcExt.temporal_id);
        }
        phVar22 = p_Vid_00->p_Cur->sei;
        if ((phVar22 != (h264_sei_t *)0x0) &&
           ((((p_Vid_00->active_sps->vui_parameters_present_flag != 0 &&
              ((p_Vid_00->active_sps->vui_seq_parameters).pic_struct_present_flag != 0)) &&
             (phVar22->type == 1)) || ((phVar22->pic_timing).pic_struct != 0)))) {
          uVar65 = (phVar22->pic_timing).pic_struct;
          switch(uVar65) {
          case 3:
          case 5:
            *(undefined4 *)((long)pvVar16 + 0x28) = 7;
            if ((uVar65 | 2) == 6) goto switchD_00199a5c_caseD_4;
            break;
          case 4:
          case 6:
switchD_00199a5c_caseD_4:
            *(undefined4 *)((long)pvVar16 + 0x28) = 0xb;
          }
        }
        RVar33 = (phVar23->cfg->base).enable_thumbnail;
        if ((RVar33 == 0) || ((phVar23->hw_info->field_0x6 & 8) == 0)) {
          RVar33 = 0;
        }
        mpp_frame_set_thumbnail_en(phVar23->curframe,RVar33);
        phVar10 = p_Vid_00->active_sps;
        if (phVar10->vui_parameters_present_flag != 0) {
          if (((phVar10->vui_seq_parameters).video_signal_type_present_flag == 0) ||
             (uVar41 = 2, (phVar10->vui_seq_parameters).video_full_range_flag == 0)) {
            uVar41 = 1;
          }
          *(undefined4 *)((long)pvVar16 + 0x54) = uVar41;
          if ((phVar10->vui_seq_parameters).colour_description_present_flag == 0) {
            *(undefined8 *)((long)pvVar16 + 0x58) = 0x200000002;
            *(undefined4 *)((long)pvVar16 + 0x60) = 2;
          }
          else {
            *(RK_U32 *)((long)pvVar16 + 0x58) = (phVar10->vui_seq_parameters).colour_primaries;
            RVar33 = (phVar10->vui_seq_parameters).transfer_characteristics;
            *(RK_U32 *)((long)pvVar16 + 0x5c) = RVar33;
            *(RK_U32 *)((long)pvVar16 + 0x60) = (phVar10->vui_seq_parameters).matrix_coefficients;
            if (RVar33 == 0x10) {
              *(byte *)((long)pvVar16 + 0x6b) = *(byte *)((long)pvVar16 + 0x6b) | 4;
            }
          }
        }
        phVar21 = p_Vid_00->p_Cur;
        if ((phVar21->hdr_dynamic != 0) &&
           (phVar21->hdr_dynamic_meta != (MppFrameHdrDynamicMeta *)0x0)) {
          *(MppFrameHdrDynamicMeta **)((long)pvVar16 + 0x90) = phVar21->hdr_dynamic_meta;
          phVar21->hdr_dynamic = 0;
          *(byte *)((long)pvVar16 + 0x6b) = *(byte *)((long)pvVar16 + 0x6b) | 4;
        }
        *(RK_S32 *)((long)pvVar16 + 0x34) = p->poc;
        *(RK_S32 *)((long)pvVar16 + 0x30) = p->layer_id;
        uVar29 = ((ushort)*(undefined4 *)((long)pvVar16 + 0xd8) & 0xfffd) +
                 (ushort)(p->slice_type == 2) * 2;
        *(ushort *)((long)pvVar16 + 0xd8) = uVar29;
        uVar29 = (uVar29 & 0xfffb) + ((ushort)p->idr_flag & 1) * 4;
        *(ushort *)((long)pvVar16 + 0xd8) = uVar29;
        uVar30 = (uVar29 & 0xfff7) + (ushort)(p->used_for_reference == 0) * 8;
        *(ushort *)((long)pvVar16 + 0xd8) = uVar30;
        uVar29 = (ushort)((p->long_term_reference_flag & 1U) << 4);
        *(ushort *)((long)pvVar16 + 0xd8) = uVar30 & 0xffef | uVar29;
        *(ushort *)((long)pvVar16 + 0xd8) =
             uVar30 & 0xffcf | uVar29 | (ushort)(p->slice_type % 5 == 1) << 5;
        mpp_buf_slot_set_prop(phVar23->frame_slots,phVar62->slot_idx,SLOT_FRAME,phVar23->curframe);
        mpp_buf_slot_get_prop
                  (phVar23->frame_slots,phVar62->slot_idx,SLOT_FRAME_PTR,&phVar62->mframe);
        p_Vid_00->active_dpb_mark[lVar51] = phVar62;
        MVar31 = MPP_OK;
        MVar32 = MPP_ERR_UNKNOW;
      }
      if (MVar31 == 0xc) goto LAB_00199c55;
      if (MVar31 == MPP_OK) goto LAB_00198484;
      goto LAB_00199c63;
    }
LAB_00198484:
    phVar25 = p_Vid_00->active_dpb_mark[lVar51];
    if (phVar25->slot_idx < 0) {
      MVar32 = MPP_NOK;
      if ((h264d_debug & 4) != 0) {
        _mpp_log_l(4,"h264d_init","[dpb_mark_malloc] error, current mark slot idx is nagative.",
                   (char *)0x0);
      }
LAB_00199c55:
      MVar31 = MVar32;
      p->mem_mark = (h264_dpb_mark_t *)0x0;
    }
    else {
      if ((uVar38 & 0xfffffffd) == 1) {
        phVar25->top_used = phVar25->top_used + '\x01';
      }
      if ((uVar38 & 0xfffffffe) == 2) {
        phVar25->bot_used = phVar25->bot_used + '\x01';
      }
      if ((h264d_debug & 0x200) != 0) {
        _mpp_log_l(4,"h264d_init",
                   "[DPB_malloc] g_framecnt=%d, com_flag=%d, mark_idx=%d, slot_idx=%d, slice_type=%d, struct=%d, lay_id=%d\n"
                   ,(char *)0x0,(ulong)p_Vid_00->g_framecnt,(ulong)(uint)p->combine_flag,
                   (ulong)phVar25->mark_idx,(ulong)(uint)phVar25->slot_idx,
                   (ulong)(uint)p->slice_type,(ulong)(uint)p->structure,lVar51);
      }
      RVar39 = phVar25->slot_idx;
      p_Vid_00->p_Dec->in_task->output = RVar39;
      mpp_buf_slot_set_flag(phVar23->frame_slots,RVar39,SLOT_HAL_OUTPUT);
      phVar23->last_frame_slot_idx = phVar25->slot_idx;
      phVar25 = p_Vid_00->active_dpb_mark[lVar51];
      p->mem_mark = phVar25;
      phVar25->pic = p;
      MVar31 = MPP_OK;
    }
LAB_00199c63:
    if (MVar31 < MPP_OK) {
      if ((h264d_debug & 4) != 0) {
        pcVar44 = "Function error(%d).\n";
        goto LAB_00197549;
      }
      goto LAB_0019798c;
    }
    if ((phVar9->cfg->base).disable_dpb_chk == 0) {
      phVar37 = p_Vid_00->last_pic;
      if (((phVar37 != (h264_store_pic_t *)0x0) && (uVar38 = p->slice_type, uVar38 != 2)) &&
         ((currSlice->p_Cur->sps).gaps_in_frame_num_value_allowed_flag == 0)) {
        if (p->combine_flag == 0) {
          RVar33 = currSlice->p_Vid->last_ref_frame_num;
          if (p->frame_num != RVar33) {
            bVar66 = p->frame_num == (RVar33 + 1) % (uint)currSlice->p_Vid->max_frame_num;
            goto LAB_00199e38;
          }
          bVar66 = false;
        }
        else {
          bVar66 = p->frame_num == phVar37->frame_num;
LAB_00199e38:
          bVar66 = !bVar66;
        }
        phVar23 = currSlice->p_Dec;
        pRVar4 = &(phVar23->errctx).cur_err_flag;
        *pRVar4 = *pRVar4 | (uint)bVar66;
        pRVar4 = &(phVar23->errctx).dpb_err_flag;
        *pRVar4 = *pRVar4 | (uint)bVar66;
        if ((h264d_debug & 0x40000) != 0) {
          _mpp_log_l(4,"h264d_init",
                     "[discontinuous] last_slice=%d, cur_slice=%d, last_fnum=%d, cur_fnum=%d, last_poc=%d, cur_poc=%d"
                     ,(char *)0x0,(ulong)(uint)phVar37->slice_type,(ulong)uVar38,
                     (ulong)phVar37->frame_num,(ulong)p->frame_num,(ulong)(uint)phVar37->poc,
                     (ulong)(uint)p->poc);
        }
      }
      if ((p->idr_flag != 0) || (p->used_for_reference != 0)) {
        currSlice->p_Vid->last_ref_frame_num = p->frame_num;
      }
    }
    p->mem_malloc_type = Mem_Malloc;
    p->colmv_no_used_flag = '\0';
    MVar31 = MPP_OK;
  }
  p_Vid_00->dec_pic = p;
  if (MVar31 < MPP_OK) {
    if ((h264d_debug & 4) == 0) {
      return MVar31;
    }
    uVar53 = 0x814;
    goto LAB_0019ad38;
  }
  if (((((phVar9->errctx).i_slice_no < 2) && (currSlice->layer_id == 0)) &&
      (currSlice->slice_type == 2)) || (currSlice->idr_flag != 0)) {
    (phVar9->errctx).first_iframe_poc = p_Vid_00->dec_pic->poc;
    (phVar9->errctx).first_iframe_is_output = 0;
  }
  if (((currSlice->layer_id != 0) && (currSlice->svc_extension_flag == 0)) &&
     ((currSlice->mvcExt).non_idr_flag == 0)) {
    if (((currSlice->layer_id != 1) && ((h264d_debug & 2) != 0)) &&
       (_mpp_log_l(2,"h264d_init","Assertion %s failed at %s:%d\n",(char *)0x0,
                   "currSlice->layer_id == 1","init_picture",0x81c), (mpp_debug._3_1_ & 0x10) != 0))
    {
LAB_0019af2f:
      abort();
    }
    MVar31 = idr_memory_management(p_Vid_00->p_Dpb_layer[currSlice->layer_id],p_Vid_00->dec_pic);
    if (MVar31 < MPP_OK) {
      if ((h264d_debug & 4) == 0) {
        return MVar31;
      }
      uVar53 = 0x81d;
      goto LAB_0019ad38;
    }
  }
  phVar37 = p_Vid_00->last_pic;
  if (phVar37 != (h264_store_pic_t *)0x0) {
    phVar13 = p_Vid_00->dec_pic;
    if (((phVar13->poc != 0) && (phVar13->frame_num <= phVar37->frame_num)) &&
       ((phVar13->poc <= phVar37->poc && ((phVar13->slice_type == 2 && (phVar13->structure == 3)))))
       ) {
      if (currSlice->layer_id == 0) {
        MVar31 = flush_dpb(p_Vid_00->p_Dpb_layer[0],1);
        if (MVar31 < MPP_OK) {
          if ((h264d_debug & 4) == 0) {
            return MVar31;
          }
          uVar53 = 0x827;
          goto LAB_0019ad38;
        }
      }
      else {
        MVar31 = flush_dpb(p_Vid_00->p_Dpb_layer[1],2);
        if (MVar31 < MPP_OK) {
          if ((h264d_debug & 4) == 0) {
            return MVar31;
          }
          uVar53 = 0x829;
          goto LAB_0019ad38;
        }
      }
    }
  }
  update_ref_list(p_Vid_00->p_Dpb_layer[currSlice->layer_id]);
  update_ltref_list(p_Vid_00->p_Dpb_layer[currSlice->layer_id]);
  phVar17 = currSlice->p_Vid;
  iVar43 = 1 << ((char)phVar17->active_sps->log2_max_frame_num_minus4 + 4U & 0x1f);
  phVar11 = currSlice->p_Dpb;
  if (currSlice->idr_flag == 0) {
    if (currSlice->structure == 1) {
      iVar40 = 0;
      iVar56 = 1;
    }
    else {
      if (currSlice->structure == 3) {
        uVar38 = phVar11->ref_frames_in_buffer;
        if ((ulong)uVar38 != 0) {
          pphVar36 = phVar11->fs_ref;
          uVar50 = 0;
          do {
            phVar18 = pphVar36[uVar50];
            if (((phVar18->is_used == 3) &&
                (phVar37 = phVar18->frame, phVar37->used_for_reference != 0)) &&
               (phVar37->is_long_term == '\0')) {
              iVar56 = 0;
              if (currSlice->frame_num < (int)phVar18->frame_num) {
                iVar56 = iVar43;
              }
              iVar56 = phVar18->frame_num - iVar56;
              phVar18->frame_num_wrap = iVar56;
              phVar37->pic_num = iVar56;
            }
            uVar50 = uVar50 + 1;
          } while (uVar38 != uVar50);
        }
        uVar38 = phVar11->ltref_frames_in_buffer;
        if ((ulong)uVar38 != 0) {
          pphVar36 = phVar11->fs_ltref;
          uVar50 = 0;
          do {
            if ((pphVar36[uVar50]->is_used == 3) &&
               (phVar37 = pphVar36[uVar50]->frame, phVar37->is_long_term != '\0')) {
              phVar37->long_term_pic_num = phVar37->long_term_frame_idx;
            }
            uVar50 = uVar50 + 1;
          } while (uVar38 != uVar50);
        }
        goto LAB_00198958;
      }
      iVar40 = 1;
      iVar56 = 0;
    }
    uVar38 = phVar11->ref_frames_in_buffer;
    if ((ulong)uVar38 != 0) {
      pphVar36 = phVar11->fs_ref;
      uVar50 = 0;
      do {
        phVar18 = pphVar36[uVar50];
        uVar65 = phVar18->is_reference;
        if (uVar65 != 0) {
          iVar58 = iVar43;
          if ((int)phVar18->frame_num <= currSlice->frame_num) {
            iVar58 = 0;
          }
          phVar18->frame_num_wrap = phVar18->frame_num - iVar58;
          if ((uVar65 & 1) != 0) {
            phVar18->top_field->pic_num = iVar56 + phVar18->frame_num_wrap * 2;
          }
          if ((uVar65 & 2) != 0) {
            phVar18->bottom_field->pic_num = iVar40 + phVar18->frame_num_wrap * 2;
          }
        }
        uVar50 = uVar50 + 1;
      } while (uVar38 != uVar50);
    }
    uVar38 = phVar11->ltref_frames_in_buffer;
    if ((ulong)uVar38 != 0) {
      pphVar36 = phVar11->fs_ltref;
      uVar50 = 0;
      do {
        phVar18 = pphVar36[uVar50];
        uVar65 = phVar18->is_long_term;
        if ((uVar65 & 1) != 0) {
          phVar18->top_field->long_term_pic_num =
               iVar56 + phVar18->top_field->long_term_frame_idx * 2;
        }
        if ((uVar65 & 2) != 0) {
          phVar18->bottom_field->long_term_pic_num =
               iVar40 + phVar18->bottom_field->long_term_frame_idx * 2;
        }
        uVar50 = uVar50 + 1;
      } while (uVar38 != uVar50);
    }
LAB_00198958:
    iVar43 = currSlice->structure;
    RVar39 = currSlice->ThisPOC;
    RVar6 = currSlice->anchor_pic_flag;
    pRVar3 = currSlice->listXsizeP;
    pRVar45 = &currSlice->listinterviewidx0;
    currSlice->listinterviewidx0 = 0;
    currSlice->listinterviewidx1 = 0;
    currSlice->listXsizeP[0] = '\0';
    currSlice->listXsizeP[1] = '\0';
    if (iVar43 == 3) {
      uVar38 = phVar11->ref_frames_in_buffer;
      if ((ulong)uVar38 == 0) {
        iVar43 = 0;
      }
      else {
        uVar50 = 0;
        iVar43 = 0;
        do {
          if (((phVar11->fs_ref[uVar50]->is_used == 3) &&
              (phVar37 = phVar11->fs_ref[uVar50]->frame, phVar37->used_for_reference != 0)) &&
             (phVar37->is_long_term == '\0')) {
            lVar51 = (long)iVar43;
            iVar43 = iVar43 + 1;
            currSlice->listP[0][lVar51] = phVar37;
          }
          uVar50 = uVar50 + 1;
        } while (uVar38 != uVar50);
      }
      qsort(currSlice->listP[0],(long)iVar43,8,compare_pic_by_pic_num_desc);
      currSlice->listXsizeP[0] = (RK_U8)iVar43;
      uVar38 = phVar11->ltref_frames_in_buffer;
      if ((ulong)uVar38 != 0) {
        uVar50 = 0;
        do {
          if ((phVar11->fs_ltref[uVar50]->is_used == 3) &&
             (phVar37 = phVar11->fs_ltref[uVar50]->frame, phVar37->is_long_term != '\0')) {
            lVar51 = (long)iVar43;
            iVar43 = iVar43 + 1;
            currSlice->listP[0][lVar51] = phVar37;
          }
          uVar50 = uVar50 + 1;
        } while (uVar38 != uVar50);
      }
      qsort(currSlice->listP[0] + currSlice->listXsizeP[0],
            (long)iVar43 - (ulong)currSlice->listXsizeP[0],8,compare_pic_by_lt_pic_num_asc);
      currSlice->listXsizeP[0] = (RK_U8)iVar43;
LAB_00198bf3:
      currSlice->listXsizeP[1] = '\0';
      if ((((currSlice->mvcExt).valid == 0) || (phVar17->active_mvc_sps_flag == 0)) ||
         (currSlice->svc_extension_flag != 0)) {
LAB_00198c13:
        uVar50 = (ulong)*pRVar3;
        if (uVar50 < 0x21) {
          do {
            currSlice->listP[0][uVar50] = phVar17->no_ref_pic;
            uVar50 = uVar50 + 1;
          } while (uVar50 != 0x21);
        }
        uVar50 = (ulong)currSlice->listXsizeP[1];
        if (uVar50 < 0x21) {
          do {
            currSlice->listP[1][uVar50] = phVar17->no_ref_pic;
            uVar50 = uVar50 + 1;
          } while (uVar50 != 0x21);
        }
        pphVar36 = currSlice->fs_listinterview0;
        MVar31 = MPP_OK;
        goto LAB_00198e7b;
      }
      RVar7 = currSlice->layer_id;
      ppHVar34 = (H264_FrameStore_t **)
                 mpp_osal_calloc("init_lists_p_slice_mvc",(ulong)phVar11->size << 3);
      currSlice->fs_listinterview0 = ppHVar34;
      if (ppHVar34 == (H264_FrameStore_t **)0x0) {
        MVar31 = 0xc;
        MVar32 = MPP_ERR_MALLOC;
        if ((h264d_debug & 1) != 0) {
          pcVar44 = "malloc buffer error(%d).\n";
          uVar53 = 0x47f;
LAB_00198e25:
          MVar31 = 0xc;
          _mpp_log_l(4,"h264d_init",pcVar44,(char *)0x0,uVar53);
        }
      }
      else if (currSlice->structure == 3) {
        bVar57 = *pRVar3;
        MVar32 = append_interview_list
                           (phVar17->p_Dpb_layer[1],3,0,ppHVar34,pRVar45,RVar39,RVar7,RVar6);
        if (MVar32 < MPP_OK) {
          MVar31 = 0xc;
          if ((h264d_debug & 4) != 0) {
            pcVar44 = "Function error(%d).\n";
            uVar53 = 0x483;
            goto LAB_00198e25;
          }
        }
        else {
          uVar38 = *pRVar45;
          if ((ulong)uVar38 != 0) {
            uVar50 = 0;
            do {
              *(h264_store_pic_t **)
               ((long)currSlice->listP[0] + uVar50 * 8 + (ulong)((uint)bVar57 * 8)) =
                   currSlice->fs_listinterview0[uVar50]->frame;
              uVar50 = uVar50 + 1;
            } while (uVar38 != uVar50);
            bVar57 = bVar57 + (char)uVar50;
          }
          *pRVar3 = bVar57;
          MVar32 = MPP_OK;
          MVar31 = MPP_OK;
        }
      }
      else {
        MVar31 = MPP_OK;
        MVar32 = append_interview_list
                           (phVar17->p_Dpb_layer[1],currSlice->structure,0,ppHVar34,pRVar45,RVar39,
                            RVar7,RVar6);
        if (MVar32 < MPP_OK) {
          MVar31 = 0xc;
          if ((h264d_debug & 4) != 0) {
            pcVar44 = "Function error(%d).\n";
            uVar53 = 0x48a;
            goto LAB_00198e25;
          }
        }
        else {
          gen_pic_list_from_frame_interview_list
                    (currSlice->structure,currSlice->fs_listinterview0,currSlice->listinterviewidx0,
                     currSlice->listP[0],pRVar3);
        }
      }
      if (MVar31 == 0xc) {
        ppHVar35 = (H264_FrameStore_t **)0x0;
        ppHVar34 = (H264_FrameStore_t **)0x0;
        MVar31 = MVar32;
        goto LAB_00198e45;
      }
      if (MVar31 == MPP_OK) goto LAB_00198c13;
    }
    else {
      ppHVar34 = (H264_FrameStore_t **)
                 mpp_osal_calloc("init_lists_p_slice_mvc",(ulong)phVar11->size << 3);
      ppHVar35 = (H264_FrameStore_t **)
                 mpp_osal_calloc("init_lists_p_slice_mvc",(ulong)phVar11->size << 3);
      if (ppHVar35 != (H264_FrameStore_t **)0x0 && ppHVar34 != (H264_FrameStore_t **)0x0) {
        uVar38 = phVar11->ref_frames_in_buffer;
        uVar50 = 0;
        iVar43 = 0;
        if ((ulong)uVar38 != 0) {
          uVar54 = 0;
          iVar43 = 0;
          do {
            if (phVar11->fs_ref[uVar54]->is_reference != 0) {
              lVar51 = (long)iVar43;
              iVar43 = iVar43 + 1;
              ppHVar34[lVar51] = phVar11->fs_ref[uVar54];
            }
            uVar54 = uVar54 + 1;
          } while (uVar38 != uVar54);
        }
        qsort(ppHVar34,(long)iVar43,8,compare_fs_by_frame_num_desc);
        currSlice->listXsizeP[0] = '\0';
        gen_pic_list_from_frame_list
                  (currSlice->structure,ppHVar34,iVar43,currSlice->listP[0],pRVar3,0);
        uVar38 = phVar11->ltref_frames_in_buffer;
        if ((ulong)uVar38 != 0) {
          uVar50 = 0;
          do {
            ppHVar35[uVar50] = phVar11->fs_ltref[uVar50];
            uVar50 = uVar50 + 1;
          } while (uVar38 != uVar50);
        }
        qsort(ppHVar35,uVar50 & 0xffffffff,8,compare_fs_by_lt_pic_idx_asc);
        gen_pic_list_from_frame_list
                  (currSlice->structure,ppHVar35,(RK_S32)uVar50,currSlice->listP[0],pRVar3,1);
        mpp_osal_free("init_lists_p_slice_mvc",ppHVar34);
        mpp_osal_free("init_lists_p_slice_mvc",ppHVar35);
        goto LAB_00198bf3;
      }
      MVar31 = MPP_ERR_MALLOC;
      if ((h264d_debug & 1) != 0) {
        _mpp_log_l(4,"h264d_init","malloc buffer error(%d).\n",(char *)0x0,0x468);
      }
LAB_00198e45:
      if (ppHVar34 != (H264_FrameStore_t **)0x0) {
        mpp_osal_free("init_lists_p_slice_mvc",ppHVar34);
      }
      if (ppHVar35 != (H264_FrameStore_t **)0x0) {
        mpp_osal_free("init_lists_p_slice_mvc",ppHVar35);
      }
      pphVar36 = currSlice->fs_listinterview0;
LAB_00198e7b:
      if (pphVar36 != (h264_frame_store_t **)0x0) {
        mpp_osal_free("init_lists_p_slice_mvc",pphVar36);
      }
      currSlice->fs_listinterview0 = (h264_frame_store_t **)0x0;
    }
    if (MVar31 < MPP_OK) {
      if ((h264d_debug & 4) == 0) {
        return MVar31;
      }
      uVar53 = 0x832;
      goto LAB_0019ad38;
    }
    phVar17 = currSlice->p_Vid;
    phVar11 = currSlice->p_Dpb;
    iVar43 = currSlice->structure;
    RVar39 = currSlice->ThisPOC;
    RVar6 = currSlice->anchor_pic_flag;
    pRVar3 = currSlice->listXsizeB;
    currSlice->listXsizeB[0] = '\0';
    currSlice->listXsizeB[1] = '\0';
    list_size = currSlice->listXsizeB + 1;
    currSlice->listinterviewidx0 = 0;
    currSlice->listinterviewidx1 = 0;
    if (iVar43 == 3) {
      uVar38 = phVar11->ref_frames_in_buffer;
      if ((ulong)uVar38 == 0) {
        uVar65 = 0;
      }
      else {
        uVar50 = 0;
        uVar65 = 0;
        do {
          if ((((phVar11->fs_ref[uVar50]->is_used == 3) &&
               (phVar37 = phVar11->fs_ref[uVar50]->frame, phVar37->used_for_reference != 0)) &&
              (phVar37->is_long_term == '\0')) && (phVar37->poc <= currSlice->framepoc)) {
            lVar51 = (long)(int)uVar65;
            uVar65 = uVar65 + 1;
            currSlice->listB[0][lVar51] = phVar37;
          }
          uVar50 = uVar50 + 1;
        } while (uVar38 != uVar50);
      }
      sVar63 = (size_t)(int)uVar65;
      qsort(currSlice->listB[0],sVar63,8,compare_pic_by_poc_desc);
      uVar38 = phVar11->ref_frames_in_buffer;
      uVar47 = uVar65;
      if ((ulong)uVar38 != 0) {
        uVar50 = 0;
        do {
          if (((phVar11->fs_ref[uVar50]->is_used == 3) &&
              (phVar37 = phVar11->fs_ref[uVar50]->frame, phVar37->used_for_reference != 0)) &&
             ((phVar37->is_long_term == '\0' && (currSlice->framepoc < phVar37->poc)))) {
            lVar51 = (long)(int)uVar47;
            uVar47 = uVar47 + 1;
            currSlice->listB[0][lVar51] = phVar37;
          }
          uVar50 = uVar50 + 1;
        } while (uVar38 != uVar50);
      }
      qsort(currSlice->listB[0] + sVar63,(long)(int)(uVar47 - uVar65),8,compare_pic_by_poc_asc);
      if (0 < (int)uVar65) {
        uVar50 = 0;
        do {
          currSlice->listB[1][((long)(int)uVar47 + uVar50) - sVar63] = currSlice->listB[0][uVar50];
          uVar50 = uVar50 + 1;
        } while (uVar65 != uVar50);
      }
      if ((int)uVar65 < (int)uVar47) {
        lVar51 = 0;
        do {
          currSlice->listB[1][lVar51] = currSlice->listB[0][sVar63 + lVar51];
          lVar51 = lVar51 + 1;
        } while ((long)(int)uVar47 - sVar63 != lVar51);
      }
      *list_size = (byte)uVar47;
      *pRVar3 = (byte)uVar47;
      uVar38 = phVar11->ltref_frames_in_buffer;
      if ((ulong)uVar38 != 0) {
        uVar50 = 0;
        do {
          if ((phVar11->fs_ltref[uVar50]->is_used == 3) &&
             (phVar37 = phVar11->fs_ltref[uVar50]->frame, phVar37->is_long_term != '\0')) {
            currSlice->listB[0][(int)uVar47] = phVar37;
            currSlice->listB[1][(int)uVar47] = phVar11->fs_ltref[uVar50]->frame;
            uVar47 = uVar47 + 1;
          }
          uVar50 = uVar50 + 1;
        } while (uVar38 != uVar50);
      }
      qsort(currSlice->listB[0] + currSlice->listXsizeB[0],
            (long)(int)uVar47 - (ulong)currSlice->listXsizeB[0],8,compare_pic_by_lt_pic_num_asc);
      qsort(currSlice->listB[1] + currSlice->listXsizeB[0],
            (long)(int)uVar47 - (ulong)currSlice->listXsizeB[0],8,compare_pic_by_lt_pic_num_asc);
      currSlice->listXsizeB[1] = (RK_U8)uVar47;
      currSlice->listXsizeB[0] = (RK_U8)uVar47;
LAB_00199412:
      bVar57 = *pRVar3;
      if ((1 < (ulong)bVar57) && (bVar57 == *list_size)) {
        pphVar20 = currSlice->listB[1];
        uVar50 = 0;
        do {
          if (currSlice->listB[0][uVar50] != pphVar20[uVar50]) goto LAB_0019945c;
          uVar50 = uVar50 + 1;
        } while (bVar57 != uVar50);
        phVar37 = *pphVar20;
        *pphVar20 = pphVar20[1];
        currSlice->listB[1][1] = phVar37;
      }
LAB_0019945c:
      if ((((currSlice->mvcExt).valid == 0) || (phVar17->active_mvc_sps_flag == 0)) ||
         (currSlice->svc_extension_flag != 0)) {
LAB_0019947a:
        uVar50 = (ulong)*pRVar3;
        if (uVar50 < 0x21) {
          do {
            currSlice->listB[0][uVar50] = phVar17->no_ref_pic;
            uVar50 = uVar50 + 1;
          } while (uVar50 != 0x21);
        }
        uVar50 = (ulong)*list_size;
        if (uVar50 < 0x21) {
          do {
            currSlice->listB[1][uVar50] = phVar17->no_ref_pic;
            uVar50 = uVar50 + 1;
          } while (uVar50 != 0x21);
        }
        if (currSlice->fs_listinterview0 != (h264_frame_store_t **)0x0) {
          mpp_osal_free("init_lists_b_slice_mvc",currSlice->fs_listinterview0);
        }
        currSlice->fs_listinterview0 = (h264_frame_store_t **)0x0;
        pphVar36 = currSlice->fs_listinterview1;
        MVar31 = MPP_OK;
        goto LAB_00199fe2;
      }
      RVar7 = currSlice->layer_id;
      pphVar36 = (h264_frame_store_t **)
                 mpp_osal_calloc("init_lists_b_slice_mvc",(ulong)phVar11->size << 3);
      currSlice->fs_listinterview0 = pphVar36;
      pphVar36 = (h264_frame_store_t **)
                 mpp_osal_calloc("init_lists_b_slice_mvc",(ulong)phVar11->size << 3);
      currSlice->fs_listinterview1 = pphVar36;
      ppHVar34 = currSlice->fs_listinterview0;
      if ((ppHVar34 == (H264_FrameStore_t **)0x0) || (pphVar36 == (h264_frame_store_t **)0x0)) {
        MVar31 = 0x15;
        MVar32 = MPP_ERR_MALLOC;
        if ((h264d_debug & 1) != 0) {
          pcVar44 = "malloc buffer error(%d).\n";
          goto LAB_0019966a;
        }
      }
      else {
        pRVar1 = &currSlice->listinterviewidx1;
        if (currSlice->structure == 3) {
          bVar57 = currSlice->listXsizeB[0];
          MVar32 = append_interview_list
                             (phVar17->p_Dpb_layer[1],3,0,ppHVar34,pRVar45,RVar39,RVar7,RVar6);
          if ((MVar32 < MPP_OK) ||
             (MVar32 = append_interview_list
                                 (phVar17->p_Dpb_layer[1],currSlice->structure,1,
                                  currSlice->fs_listinterview1,pRVar1,RVar39,RVar7,RVar6),
             MVar32 < MPP_OK)) {
            if ((h264d_debug & 4) != 0) {
              _mpp_log_l(4,"h264d_init","Function error(%d).\n",(char *)0x0);
            }
            MVar31 = 0x15;
          }
          else {
            uVar38 = *pRVar45;
            if ((ulong)uVar38 != 0) {
              uVar50 = 0;
              do {
                *(h264_store_pic_t **)
                 ((long)currSlice->listB[0] + uVar50 * 8 + (ulong)((uint)bVar57 * 8)) =
                     currSlice->fs_listinterview0[uVar50]->frame;
                uVar50 = uVar50 + 1;
              } while (uVar38 != uVar50);
              bVar57 = bVar57 + (char)uVar50;
            }
            *pRVar3 = bVar57;
            bVar57 = *list_size;
            uVar38 = *pRVar1;
            if ((ulong)uVar38 != 0) {
              uVar50 = 0;
              do {
                *(h264_store_pic_t **)
                 ((long)currSlice->listB[1] + uVar50 * 8 + (ulong)((uint)bVar57 * 8)) =
                     currSlice->fs_listinterview1[uVar50]->frame;
                uVar50 = uVar50 + 1;
              } while (uVar38 != uVar50);
              bVar57 = bVar57 + (char)uVar50;
            }
            *list_size = bVar57;
LAB_00199f4d:
            MVar32 = MPP_OK;
            MVar31 = MPP_OK;
          }
        }
        else {
          MVar32 = append_interview_list
                             (phVar17->p_Dpb_layer[1],currSlice->structure,0,ppHVar34,pRVar45,RVar39
                              ,RVar7,RVar6);
          if (MVar32 < MPP_OK) {
            MVar31 = 0x15;
            if ((h264d_debug & 4) != 0) {
              pcVar44 = "Function error(%d).\n";
LAB_0019966a:
              MVar31 = 0x15;
              _mpp_log_l(4,"h264d_init",pcVar44,(char *)0x0);
            }
          }
          else {
            gen_pic_list_from_frame_interview_list
                      (currSlice->structure,currSlice->fs_listinterview0,
                       currSlice->listinterviewidx0,currSlice->listB[0],pRVar3);
            MVar32 = append_interview_list
                               (phVar17->p_Dpb_layer[1],currSlice->structure,1,
                                currSlice->fs_listinterview1,pRVar1,RVar39,RVar7,RVar6);
            if (MPP_NOK < MVar32) {
              gen_pic_list_from_frame_interview_list
                        (currSlice->structure,currSlice->fs_listinterview1,
                         currSlice->listinterviewidx1,currSlice->listB[1],list_size);
              goto LAB_00199f4d;
            }
            MVar31 = 0x15;
            if ((h264d_debug & 4) != 0) {
              pcVar44 = "Function error(%d).\n";
              goto LAB_0019966a;
            }
          }
        }
      }
      if (MVar31 == 0x15) {
        ppHVar34 = (H264_FrameStore_t **)0x0;
        fs_list = (H264_FrameStore_t **)0x0;
        ppHVar35 = (H264_FrameStore_t **)0x0;
        MVar31 = MVar32;
        goto LAB_00199f75;
      }
      if (MVar31 == MPP_OK) goto LAB_0019947a;
    }
    else {
      ppHVar34 = (H264_FrameStore_t **)
                 mpp_osal_calloc("init_lists_b_slice_mvc",(ulong)phVar11->size << 3);
      ppHVar35 = (H264_FrameStore_t **)
                 mpp_osal_calloc("init_lists_b_slice_mvc",(ulong)phVar11->size << 3);
      fs_list = (H264_FrameStore_t **)
                mpp_osal_calloc("init_lists_b_slice_mvc",(ulong)phVar11->size << 3);
      if (((ppHVar34 != (H264_FrameStore_t **)0x0) && (ppHVar35 != (H264_FrameStore_t **)0x0)) &&
         (fs_list != (H264_FrameStore_t **)0x0)) {
        *pRVar3 = '\0';
        *list_size = 1;
        uVar38 = phVar11->ref_frames_in_buffer;
        if ((ulong)uVar38 == 0) {
          uVar65 = 0;
        }
        else {
          uVar50 = 0;
          uVar65 = 0;
          do {
            pHVar19 = phVar11->fs_ref[uVar50];
            if ((pHVar19->is_used != 0) && (pHVar19->poc <= currSlice->ThisPOC)) {
              lVar51 = (long)(int)uVar65;
              uVar65 = uVar65 + 1;
              ppHVar34[lVar51] = pHVar19;
            }
            uVar50 = uVar50 + 1;
          } while (uVar38 != uVar50);
        }
        sVar63 = (size_t)(int)uVar65;
        qsort(ppHVar34,sVar63,8,compare_fs_by_poc_desc);
        uVar38 = phVar11->ref_frames_in_buffer;
        uVar47 = uVar65;
        if ((ulong)uVar38 != 0) {
          uVar50 = 0;
          do {
            pHVar19 = phVar11->fs_ref[uVar50];
            if ((pHVar19->is_used != 0) && (currSlice->ThisPOC < pHVar19->poc)) {
              lVar51 = (long)(int)uVar47;
              uVar47 = uVar47 + 1;
              ppHVar34[lVar51] = pHVar19;
            }
            uVar50 = uVar50 + 1;
          } while (uVar38 != uVar50);
        }
        qsort(ppHVar34 + sVar63,(long)(int)(uVar47 - uVar65),8,compare_fs_by_poc_asc);
        if (0 < (int)uVar65) {
          uVar50 = 0;
          do {
            ppHVar35[(long)(int)(uVar47 - uVar65) + uVar50] = ppHVar34[uVar50];
            uVar50 = uVar50 + 1;
          } while (uVar65 != uVar50);
        }
        if ((int)uVar65 < (int)uVar47) {
          lVar51 = 0;
          do {
            ppHVar35[lVar51] = (ppHVar34 + sVar63)[lVar51];
            lVar51 = lVar51 + 1;
          } while ((long)(int)uVar47 - sVar63 != lVar51);
        }
        currSlice->listXsizeB[0] = '\0';
        currSlice->listXsizeB[1] = '\0';
        uVar50 = 0;
        gen_pic_list_from_frame_list
                  (currSlice->structure,ppHVar34,uVar47,currSlice->listB[0],pRVar3,0);
        gen_pic_list_from_frame_list
                  (currSlice->structure,ppHVar35,uVar47,currSlice->listB[1],list_size,0);
        uVar38 = phVar11->ltref_frames_in_buffer;
        if ((ulong)uVar38 != 0) {
          uVar50 = 0;
          do {
            fs_list[uVar50] = phVar11->fs_ltref[uVar50];
            uVar50 = uVar50 + 1;
          } while (uVar38 != uVar50);
        }
        qsort(fs_list,uVar50 & 0xffffffff,8,compare_fs_by_lt_pic_idx_asc);
        gen_pic_list_from_frame_list
                  (currSlice->structure,fs_list,(RK_S32)uVar50,currSlice->listB[0],pRVar3,1);
        gen_pic_list_from_frame_list
                  (currSlice->structure,fs_list,(RK_S32)uVar50,currSlice->listB[1],list_size,1);
        mpp_osal_free("init_lists_b_slice_mvc",ppHVar34);
        mpp_osal_free("init_lists_b_slice_mvc",ppHVar35);
        mpp_osal_free("init_lists_b_slice_mvc",fs_list);
        goto LAB_00199412;
      }
      MVar31 = MPP_ERR_MALLOC;
      if ((h264d_debug & 1) != 0) {
        _mpp_log_l(4,"h264d_init","malloc buffer error(%d).\n",(char *)0x0);
      }
LAB_00199f75:
      if (ppHVar34 != (H264_FrameStore_t **)0x0) {
        mpp_osal_free("init_lists_b_slice_mvc",ppHVar34);
      }
      if (ppHVar35 != (H264_FrameStore_t **)0x0) {
        mpp_osal_free("init_lists_b_slice_mvc",ppHVar35);
      }
      if (fs_list != (H264_FrameStore_t **)0x0) {
        mpp_osal_free("init_lists_b_slice_mvc",fs_list);
      }
      if (currSlice->fs_listinterview0 != (h264_frame_store_t **)0x0) {
        mpp_osal_free("init_lists_b_slice_mvc",currSlice->fs_listinterview0);
      }
      currSlice->fs_listinterview0 = (h264_frame_store_t **)0x0;
      pphVar36 = currSlice->fs_listinterview1;
LAB_00199fe2:
      if (pphVar36 != (h264_frame_store_t **)0x0) {
        mpp_osal_free("init_lists_b_slice_mvc",pphVar36);
      }
      currSlice->fs_listinterview1 = (h264_frame_store_t **)0x0;
    }
    if (MVar31 < MPP_OK) {
      if ((h264d_debug & 4) == 0) {
        return MVar31;
      }
      uVar53 = 0x833;
      goto LAB_0019ad38;
    }
  }
  else if (currSlice->layer_id != 0) goto LAB_00198958;
  phVar11 = currSlice->p_Dpb;
  phVar23 = currSlice->p_Dec;
  lVar51 = 0;
  do {
    phVar55 = phVar23->dpb_info;
    *(undefined8 *)((long)&phVar55->refpic + lVar51) = 0;
    *(undefined4 *)((long)&phVar55->BOT_POC + lVar51) = 0;
    *(undefined8 *)((long)&phVar55->field_flag + lVar51) = 0;
    *(undefined8 *)((long)&phVar55->slot_index + lVar51) = 0xffffffff;
    (&phVar55->colmv_is_used)[lVar51] = '\0';
    *(undefined2 *)((long)&phVar55->frame_num + lVar51) = 0;
    puVar5 = (undefined8 *)((long)&phVar55->long_term_pic_num + lVar51);
    *puVar5 = 0;
    puVar5[1] = 0;
    lVar51 = lVar51 + 0x50;
  } while (lVar51 != 0x500);
  uVar38 = phVar11->ref_frames_in_buffer;
  if ((ulong)uVar38 == 0) {
    uVar50 = 0;
  }
  else {
    pphVar36 = phVar11->fs_ref;
    phVar55 = phVar23->dpb_info;
    uVar50 = 0;
    do {
      phVar18 = pphVar36[uVar50];
      uVar65 = phVar18->is_used;
      if (uVar65 != 0) {
        if (uVar65 == 3) {
          phVar55->refpic = phVar18->frame;
          phVar18 = pphVar36[uVar50];
          phVar37 = phVar18->frame;
          iVar43 = phVar37->iCodingType;
          if (iVar43 == 1) {
            phVar55->TOP_POC = phVar18->top_field->poc;
            RVar39 = phVar18->bottom_field->poc;
          }
          else {
            iVar56 = phVar37->frame_poc;
            if (iVar56 == phVar37->poc) {
              phVar55->TOP_POC = phVar37->top_poc;
              RVar39 = phVar37->bottom_poc;
            }
            else {
              phVar55->TOP_POC = phVar37->top_poc - iVar56;
              RVar39 = phVar37->bottom_poc - iVar56;
            }
          }
          phVar55->BOT_POC = RVar39;
          phVar55->field_flag = (uint)(iVar43 == 1);
        }
        else {
          if ((uVar65 & 1) == 0) {
            phVar55->refpic = phVar18->bottom_field;
            phVar55->TOP_POC = 0;
            phVar37 = pphVar36[uVar50]->bottom_field;
            phVar55->BOT_POC = phVar37->poc;
          }
          else {
            phVar55->refpic = phVar18->top_field;
            phVar37 = pphVar36[uVar50]->top_field;
            phVar55->TOP_POC = phVar37->poc;
            phVar55->BOT_POC = 0;
          }
          phVar55->field_flag = 1;
        }
        phVar55->slot_index = phVar37->mem_mark->slot_idx;
        phVar55->colmv_is_used = phVar37->colmv_no_used_flag == '\0';
      }
      phVar18 = pphVar36[uVar50];
      phVar55->frame_num = (RK_U16)phVar18->frame_num;
      phVar55->is_long_term = 0;
      phVar55->long_term_frame_idx = 0;
      phVar55->long_term_pic_num = 0;
      phVar55->voidx = phVar18->layer_id;
      phVar55->view_id = phVar18->view_id;
      phVar55->is_used = phVar18->is_used;
      uVar50 = uVar50 + 1;
      phVar55 = phVar55 + 1;
    } while (uVar38 != uVar50);
  }
  uVar65 = (uint)uVar50;
  uVar38 = phVar11->ltref_frames_in_buffer;
  if ((ulong)uVar38 != 0) {
    pphVar36 = phVar11->fs_ltref;
    phVar55 = phVar23->dpb_info;
    uVar54 = 0;
    do {
      uVar42 = (uVar50 & 0xffffffff) + uVar54;
      phVar18 = pphVar36[uVar54];
      uVar47 = phVar18->is_used;
      if (uVar47 != 0) {
        if (uVar47 == 3) {
          uVar64 = uVar42 & 0xffffffff;
          phVar55[uVar64].refpic = phVar18->frame;
          phVar18 = pphVar36[uVar54];
          phVar37 = phVar18->frame;
          iVar43 = phVar37->iCodingType;
          if (iVar43 == 1) {
            phVar55[uVar64].TOP_POC = phVar18->top_field->poc;
            RVar39 = phVar18->bottom_field->poc;
          }
          else {
            iVar56 = phVar37->frame_poc;
            if (iVar56 == phVar37->poc) {
              phVar55[uVar64].TOP_POC = phVar37->top_poc;
              RVar39 = phVar37->bottom_poc;
            }
            else {
              phVar55[uVar64].TOP_POC = phVar37->top_poc - iVar56;
              RVar39 = phVar37->bottom_poc - iVar56;
            }
          }
          phVar55[uVar64].BOT_POC = RVar39;
          phVar55[uVar64].field_flag = (uint)(iVar43 == 1);
          phVar55[uVar64].slot_index = phVar37->mem_mark->slot_idx;
        }
        else {
          uVar64 = uVar42 & 0xffffffff;
          if ((uVar47 & 1) == 0) {
            phVar55[uVar64].refpic = phVar18->bottom_field;
            phVar55[uVar64].TOP_POC = 0;
            phVar37 = pphVar36[uVar54]->bottom_field;
            phVar55[uVar64].BOT_POC = phVar37->poc;
          }
          else {
            phVar55[uVar64].refpic = phVar18->top_field;
            phVar37 = pphVar36[uVar54]->top_field;
            phVar55[uVar64].TOP_POC = phVar37->poc;
            phVar55[uVar64].BOT_POC = 0;
          }
          phVar55[uVar64].field_flag = 1;
          phVar55[uVar64].slot_index = phVar37->mem_mark->slot_idx;
        }
        phVar55[uVar42 & 0xffffffff].colmv_is_used = phVar37->colmv_no_used_flag == '\0';
        phVar55[uVar42 & 0xffffffff].long_term_pic_num = phVar37->long_term_pic_num;
      }
      phVar18 = pphVar36[uVar54];
      RVar33 = phVar18->long_term_frame_idx;
      uVar42 = uVar42 & 0xffffffff;
      phVar55[uVar42].frame_num = (RK_U16)RVar33;
      phVar55[uVar42].is_long_term = 1;
      phVar55[uVar42].long_term_frame_idx = RVar33;
      phVar55[uVar42].voidx = phVar18->layer_id;
      phVar55[uVar42].view_id = phVar18->view_id;
      phVar55[uVar42].is_used = phVar18->is_used;
      uVar54 = uVar54 + 1;
    } while (uVar38 != uVar54);
    uVar65 = uVar65 + (int)uVar54;
  }
  uVar38 = phVar11->used_size_il;
  if ((ulong)uVar38 != 0) {
    iVar43 = currSlice->structure;
    pphVar36 = phVar11->fs_ilref;
    uVar50 = 0;
    do {
      uVar54 = uVar65 + uVar50;
      phVar18 = pphVar36[uVar50];
      iVar56 = phVar18->is_used;
      if (iVar43 == 3) {
        if (iVar56 == 3) {
          if ((phVar18->inter_view_flag[0] == 0) && (phVar18->inter_view_flag[1] == 0)) break;
          phVar55 = phVar23->dpb_info;
          uVar42 = uVar54 & 0xffffffff;
          phVar55[uVar42].refpic = phVar18->frame;
          phVar37 = pphVar36[uVar50]->frame;
          bVar66 = phVar37->is_mmco_5 == '\0';
          pRVar45 = &phVar37->top_poc_mmco5;
          if (bVar66) {
            pRVar45 = &phVar37->top_poc;
          }
          phVar55[uVar42].TOP_POC = *pRVar45;
          pRVar45 = &phVar37->bottom_poc;
          if (!bVar66) {
            pRVar45 = &phVar37->bot_poc_mmco5;
          }
          phVar55[uVar42].BOT_POC = *pRVar45;
          phVar55[uVar42].field_flag = (uint)(phVar37->iCodingType == 1);
          phVar55[uVar42].slot_index = phVar37->mem_mark->slot_idx;
          phVar55[uVar42].colmv_is_used = phVar37->colmv_no_used_flag == '\0';
        }
      }
      else if (iVar56 != 0) {
        if (iVar56 == 3) {
          if (phVar18->inter_view_flag[iVar43 == 2] == 0) break;
          phVar55 = phVar23->dpb_info;
          uVar42 = uVar54 & 0xffffffff;
          phVar55[uVar42].refpic = phVar18->top_field;
          phVar18 = pphVar36[uVar50];
          phVar37 = phVar18->top_field;
          pRVar45 = &phVar37->top_poc_mmco5;
          if (phVar37->is_mmco_5 == '\0') {
            pRVar45 = &phVar37->top_poc;
          }
          phVar55[uVar42].TOP_POC = *pRVar45;
          phVar37 = phVar18->bottom_field;
          pRVar45 = &phVar37->bot_poc_mmco5;
          if (phVar37->is_mmco_5 == '\0') {
            pRVar45 = &phVar37->bottom_poc;
          }
          phVar55[uVar42].BOT_POC = *pRVar45;
          phVar37 = phVar18->frame;
          phVar55[uVar42].field_flag = (uint)(phVar37->iCodingType == 1);
          phVar55[uVar42].slot_index = phVar37->mem_mark->slot_idx;
          phVar55[uVar42].colmv_is_used = phVar37->colmv_no_used_flag == '\0';
        }
        phVar18 = pphVar36[uVar50];
        if ((phVar18->is_used & 1) == 0) {
          if (phVar18->inter_view_flag[1] == 0) break;
          phVar55 = phVar23->dpb_info;
          uVar42 = uVar54 & 0xffffffff;
          phVar55[uVar42].refpic = phVar18->bottom_field;
          phVar55[uVar42].TOP_POC = 0;
          phVar37 = pphVar36[uVar50]->bottom_field;
          pRVar45 = &phVar37->bot_poc_mmco5;
          if (phVar37->is_mmco_5 == '\0') {
            pRVar45 = &phVar37->bottom_poc;
          }
          phVar55[uVar42].BOT_POC = *pRVar45;
        }
        else {
          if (phVar18->inter_view_flag[0] == 0) break;
          phVar55 = phVar23->dpb_info;
          uVar42 = uVar54 & 0xffffffff;
          phVar55[uVar42].refpic = phVar18->top_field;
          phVar37 = pphVar36[uVar50]->top_field;
          pRVar45 = &phVar37->top_poc_mmco5;
          if (phVar37->is_mmco_5 == '\0') {
            pRVar45 = &phVar37->top_poc;
          }
          phVar55[uVar42].TOP_POC = *pRVar45;
          phVar55[uVar42].BOT_POC = 0;
        }
        uVar42 = uVar54 & 0xffffffff;
        phVar55[uVar42].field_flag = 1;
        phVar55[uVar42].slot_index = phVar37->mem_mark->slot_idx;
        phVar55[uVar42].colmv_is_used = phVar37->colmv_no_used_flag == '\0';
      }
      phVar18 = phVar11->fs_ilref[uVar50];
      phVar55 = phVar23->dpb_info;
      uVar54 = uVar54 & 0xffffffff;
      phVar55[uVar54].frame_num = (RK_U16)phVar18->frame_num;
      phVar28 = phVar55 + uVar54;
      phVar28->is_long_term = 0;
      phVar28->is_ilt_flag = 1;
      *(undefined8 *)(&phVar28->is_long_term + 2) = 0;
      phVar55[uVar54].voidx = phVar18->layer_id;
      phVar55[uVar54].view_id = phVar18->view_id;
      phVar55[uVar54].is_used = phVar18->is_used;
      uVar50 = uVar50 + 1;
    } while (uVar38 != uVar50);
  }
  phVar23 = currSlice->p_Dec;
  memset(phVar23->refpic_info_p,0,0x180);
  memset(phVar23->refpic_info_b[0],0,0x180);
  memset(phVar23->refpic_info_b[1],0,0x180);
  if ((currSlice->idr_flag == 0) || (currSlice->layer_id != 0)) {
    uVar50 = 0;
    RVar39 = 0;
    do {
      if (currSlice->listXsizeP[0] <= uVar50) break;
      phVar37 = currSlice->listP[0][uVar50];
      if (phVar37->is_mmco_5 == '\0') {
        bVar66 = false;
      }
      else {
        bVar66 = phVar37->layer_id == 0 && currSlice->layer_id != 0;
      }
      if (phVar37->structure == 1) {
        lVar51 = 8;
        if (bVar66) {
          lVar51 = 200;
        }
      }
      else if (phVar37->structure == 3) {
        lVar51 = 4;
        if (bVar66) {
          lVar51 = 0xc4;
        }
      }
      else {
        lVar51 = 0xc;
        if (bVar66) {
          lVar51 = 0xcc;
        }
      }
      iVar43 = *(int *)((long)&phVar37->structure + lVar51);
      pRVar45 = &phVar23->dpb_info->TOP_POC;
      lVar51 = 0;
      do {
        iVar56 = *pRVar45;
        iVar40 = pRVar45[1];
        uVar38 = pRVar45[10];
        if ((currSlice->structure == 3) &&
           (*(h264_store_pic_t **)(pRVar45 + 0xe) != (h264_store_pic_t *)0x0)) {
          iVar58 = iVar40;
          if (iVar56 < iVar40) {
            iVar58 = iVar56;
          }
joined_r0x0019a73a:
          if (iVar43 == iVar58) {
LAB_0019a73c:
            if (phVar37->layer_id == pRVar45[8]) {
              RVar39 = (RK_S32)lVar51;
              phVar23->refpic_info_p[uVar50].dpb_idx = RVar39;
              goto LAB_0019a7de;
            }
          }
        }
        else if (uVar38 == 3) {
          if (iVar43 == iVar56 || iVar43 == iVar40) goto LAB_0019a73c;
        }
        else {
          iVar58 = iVar56;
          if (((uVar38 & 1) != 0) || (iVar58 = iVar40, (uVar38 & 2) != 0)) goto joined_r0x0019a73a;
        }
        lVar51 = lVar51 + 1;
        pRVar45 = pRVar45 + 0x14;
      } while (lVar51 != 0x10);
      if ((((h264d_debug & 2) != 0) && (RVar39 < 0)) &&
         (_mpp_log_l(2,"h264d_init","Assertion %s failed at %s:%d\n",(char *)0x0,"near_dpb_idx >= 0"
                     ,"prepare_init_ref_info",0x728), (mpp_debug._3_1_ & 0x10) != 0))
      goto LAB_0019af2f;
      phVar23->refpic_info_p[uVar50].dpb_idx = RVar39;
      pRVar4 = &(phVar23->errctx).cur_err_flag;
      *(byte *)pRVar4 = (byte)*pRVar4 | 1;
LAB_0019a7de:
      phVar24 = phVar23->refpic_info_p;
      phVar24[uVar50].bottom_flag = (uint)(currSlice->listP[0][uVar50]->structure == 2);
      phVar24[uVar50].valid = 1;
      uVar50 = uVar50 + 1;
    } while (uVar50 != 0x20);
    lVar51 = 0;
    do {
      local_48 = 0;
      uStack_40 = 0;
      local_58 = 0;
      uStack_50 = 0;
      local_68 = 0;
      uStack_60 = 0;
      local_78 = (MppFrame)0x0;
      uStack_70 = 0;
      uVar54 = 0;
      uVar50 = 0;
      do {
        if (currSlice->listXsizeB[lVar51] <= uVar54) break;
        phVar37 = currSlice->listB[lVar51][uVar54];
        RVar33 = phVar37->layer_id;
        if (phVar37->is_mmco_5 == '\0') {
          bVar66 = false;
        }
        else {
          bVar66 = RVar33 == 0 && currSlice->layer_id != 0;
        }
        if (phVar37->structure == 1) {
          lVar46 = 8;
          lVar49 = 200;
LAB_0019a8ab:
          if (bVar66) {
            lVar46 = lVar49;
          }
        }
        else {
          if (phVar37->structure == 3) {
            lVar46 = 4;
            lVar49 = 0xc4;
            goto LAB_0019a8ab;
          }
          lVar46 = 0xc;
          if (bVar66) {
            lVar46 = 0xcc;
          }
        }
        iVar43 = *(int *)((long)&phVar37->structure + lVar46);
        pRVar45 = &phVar23->dpb_info->TOP_POC;
        uVar42 = 0;
        do {
          iVar56 = *pRVar45;
          iVar40 = pRVar45[1];
          RVar8 = pRVar45[8];
          uVar38 = pRVar45[10];
          if ((currSlice->structure == 3) &&
             (*(h264_store_pic_t **)(pRVar45 + 0xe) != (h264_store_pic_t *)0x0)) {
            if (iVar56 < iVar40) {
              iVar40 = iVar56;
            }
            if (((iVar43 == iVar40) && (RVar33 == RVar8)) &&
               (*(int *)((long)&local_78 + uVar42 * 4) == 0)) {
              *(undefined4 *)((long)&local_78 + uVar42 * 4) = 1;
              goto LAB_0019a9f1;
            }
          }
          else if (uVar38 == 3) {
            if ((iVar43 == iVar56 || iVar43 == iVar40) && (RVar33 == RVar8)) goto LAB_0019a9f1;
          }
          else if ((uVar38 & 1) == 0) {
            if (((uVar38 & 2) != 0) &&
               ((iVar43 == iVar40 && ((RVar33 == RVar8 || (currSlice->bottom_field_flag != 0)))))) {
LAB_0019a9f1:
              phVar23->refpic_info_b[lVar51][uVar54].dpb_idx = (RK_S32)uVar42;
              uVar50 = uVar42 & 0xffffffff;
              goto LAB_0019aa01;
            }
          }
          else if ((iVar43 == iVar56) && ((RVar33 == RVar8 || (currSlice->bottom_field_flag == 0))))
          goto LAB_0019a9f1;
          uVar42 = uVar42 + 1;
          pRVar45 = pRVar45 + 0x14;
        } while (uVar42 != 0x10);
        if ((((h264d_debug & 2) != 0) && ((int)uVar50 < 0)) &&
           (_mpp_log_l(2,"h264d_init","Assertion %s failed at %s:%d\n",(char *)0x0,
                       "near_dpb_idx >= 0","prepare_init_ref_info",0x767),
           (mpp_debug._3_1_ & 0x10) != 0)) goto LAB_0019af2f;
        phVar23->refpic_info_b[lVar51][uVar54].dpb_idx = (int)uVar50;
        pRVar4 = &(phVar23->errctx).cur_err_flag;
        *(byte *)pRVar4 = (byte)*pRVar4 | 1;
LAB_0019aa01:
        phVar24 = phVar23->refpic_info_b[lVar51];
        phVar24[uVar54].bottom_flag = (uint)(currSlice->listB[lVar51][uVar54]->structure == 2);
        phVar24[uVar54].valid = 1;
        uVar54 = uVar54 + 1;
      } while (uVar54 != 0x20);
      bVar66 = lVar51 == 0;
      lVar51 = lVar51 + 1;
    } while (bVar66);
  }
  phVar23 = currSlice->p_Dec;
  lVar46 = 4;
  lVar51 = 0;
  do {
    phVar55 = phVar23->dpb_info;
    if ((*(long *)(&phVar55->field_0x3c + lVar46) == 0) ||
       (*(int *)(&phVar55->colmv_is_used + lVar46) < 0)) {
      phVar23->in_task->refer[lVar51] = -1;
    }
    else {
      phVar23->in_task->refer[lVar51] = *(int *)(&phVar55->colmv_is_used + lVar46);
      mpp_buf_slot_set_flag
                (phVar23->frame_slots,*(RK_S32 *)(&phVar55->colmv_is_used + lVar46),SLOT_HAL_INPUT);
      mpp_buf_slot_set_flag
                (phVar23->frame_slots,*(RK_S32 *)(&phVar23->dpb_info->colmv_is_used + lVar46),
                 SLOT_CODEC_USE);
    }
    lVar51 = lVar51 + 1;
    lVar46 = lVar46 + 0x50;
  } while (lVar51 != 0x10);
  if ((h264d_debug & 0x100) != 0) {
    _mpp_log_l(4,"h264d_init","[DPB_INFO] cur_slot_idx=%d",(char *)0x0,
               (ulong)(uint)phVar23->in_task->output);
    uVar50 = 0;
    do {
      if ((-1 < phVar23->in_task->refer[uVar50]) && ((h264d_debug & 0x100) != 0)) {
        _mpp_log_l(4,"h264d_init","[DPB_INFO] ref_slot_idx[%d]=%d",(char *)0x0,uVar50 & 0xffffffff);
      }
      uVar50 = uVar50 + 1;
    } while (uVar50 != 0x10);
  }
  lVar51 = 0;
  uVar38 = 0;
  do {
    phVar25 = phVar23->dpb_mark;
    if ((((&phVar25->out_flag)[lVar51] != '\0') &&
        (-1 < *(int *)((long)&phVar25->slot_idx + lVar51))) &&
       (uVar38 = uVar38 + 1, (h264d_debug & 0x100) != 0)) {
      local_78 = (MppFrame)0x0;
      mpp_buf_slot_get_prop
                (phVar23->frame_slots,*(RK_S32 *)((long)&phVar25->slot_idx + lVar51),SLOT_FRAME_PTR,
                 &local_78);
      if (local_78 == (MppFrame)0x0) {
        buffer = (MppBuffer)0x0;
      }
      else {
        buffer = mpp_frame_get_buffer(local_78);
      }
      if (buffer == (MppBuffer)0x0) {
        uVar50 = 0xff;
      }
      else {
        uVar65 = mpp_buffer_get_fd_with_caller(buffer,"check_refer_dpb_buf_slots");
        uVar50 = (ulong)uVar65;
      }
      if ((h264d_debug & 0x100) != 0) {
        lVar46 = *(long *)((long)&phVar25->pic + lVar51);
        _mpp_log_l(4,"h264d_init",
                   "[DPB_MARK_INFO] slot_idx=%d, top_used=%d, bot_used=%d, out_flag=%d, fd=0x%02x, poc=%d, view_id=%d"
                   ,(char *)0x0,(ulong)*(uint *)((long)&phVar25->slot_idx + lVar51),
                   (ulong)(&phVar25->top_used)[lVar51],(ulong)(&phVar25->bot_used)[lVar51],
                   (ulong)(&phVar25->out_flag)[lVar51],uVar50,(ulong)*(uint *)(lVar46 + 4),
                   (ulong)*(uint *)(lVar46 + 0xbc));
      }
    }
    lVar51 = lVar51 + 0x20;
  } while (lVar51 != 0x460);
  if ((h264d_debug & 0x100) != 0) {
    _mpp_log_l(4,"h264d_init","[DPB_MARK_INFO] ---------- cur_slot=%d --------------------",
               (char *)0x0,(ulong)(uint)phVar23->in_task->output);
  }
  RVar33 = phVar23->p_Vid->dpb_size[0];
  RVar8 = phVar23->p_Vid->dpb_size[1];
  uVar65 = 0x12;
  if (RVar8 + RVar33 < 0x11) {
    uVar65 = RVar8 + 2 + RVar33;
  }
  MVar31 = MPP_OK;
  if (uVar65 < uVar38) {
    if ((h264d_debug & 1) != 0) {
      _mpp_log_l(4,"h264d_init","[h264d_reset_error]",(char *)0x0);
    }
    h264d_reset(phVar23);
    MVar31 = MPP_NOK;
  }
  if (uVar38 <= uVar65) {
    pHVar26 = currSlice->p_Dec;
    if (currSlice->slice_type == 2) {
      (pHVar26->errctx).dpb_err_flag = 0;
    }
    else {
      iVar43 = currSlice->slice_type % 5;
      if ((iVar43 != 2) && (iVar43 != 4)) {
        if (currSlice->ref_pic_list_reordering_flag[0] == 0) {
          uVar47 = currSlice->active_pps->num_ref_idx_l0_default_active_minus1 + 1;
          uVar38 = currSlice->num_ref_idx_override_flag;
          uVar65 = uVar47;
          if (uVar38 != 0) {
            uVar65 = currSlice->num_ref_idx_active[0];
          }
          RVar33 = check_ref_dbp_err(pHVar26,pHVar26->refpic_info_b[(ulong)(iVar43 == 1) - 1],uVar65
                                    );
          pRVar4 = &(pHVar26->errctx).cur_err_flag;
          *pRVar4 = *pRVar4 | (uint)(RVar33 != 0);
          if ((h264d_debug & 0x1000) != 0) {
            _mpp_log_l(4,"h264d_init",
                       "list0 dpb: cur_err_flag=%d, pps_refs=%d, over_flag=%d, num_ref_l0=%d\n",
                       (char *)0x0,(ulong)(pHVar26->errctx).cur_err_flag,(ulong)uVar47,(ulong)uVar38
                       ,(ulong)uVar65);
          }
        }
        else {
          RVar33 = check_ref_pic_list(currSlice,0);
          pRVar4 = &(pHVar26->errctx).cur_err_flag;
          *pRVar4 = *pRVar4 | RVar33;
        }
      }
      if (currSlice->slice_type % 5 == 1) {
        if (currSlice->ref_pic_list_reordering_flag[1] == 0) {
          uVar47 = currSlice->active_pps->num_ref_idx_l1_default_active_minus1 + 1;
          uVar38 = currSlice->num_ref_idx_override_flag;
          uVar65 = uVar47;
          if (uVar38 != 0) {
            uVar65 = currSlice->num_ref_idx_active[1];
          }
          RVar33 = check_ref_dbp_err(pHVar26,pHVar26->refpic_info_b[1],uVar65);
          uVar52 = (uint)(RVar33 != 0) | (pHVar26->errctx).cur_err_flag;
          (pHVar26->errctx).cur_err_flag = uVar52;
          if ((h264d_debug & 0x1000) != 0) {
            _mpp_log_l(4,"h264d_init",
                       "list1 dpb: cur_err_flag=%d, pps_refs=%d, over_flag=%d, num_ref_l1=%d\n",
                       (char *)0x0,(ulong)uVar52,(ulong)uVar47,(ulong)uVar38,(ulong)uVar65);
          }
        }
        else {
          RVar33 = check_ref_pic_list(currSlice,1);
          pRVar4 = &(pHVar26->errctx).cur_err_flag;
          *pRVar4 = *pRVar4 | RVar33;
        }
      }
    }
    phVar27 = phVar9->dxva_ctx;
    fill_picparams(currSlice->p_Vid,&phVar27->pp);
    if ((phVar27->pp).scaleing_list_enable_flag == '\0') {
      return MPP_OK;
    }
    prepare_init_scanlist(currSlice);
    fill_scanlist(currSlice->p_Vid,&phVar27->qm);
    return MPP_OK;
  }
  if ((h264d_debug & 4) == 0) {
    return MVar31;
  }
  uVar53 = 0x838;
LAB_0019ad38:
  _mpp_log_l(4,"h264d_init","Function error(%d).\n",(char *)0x0,uVar53);
  return MVar31;
}

Assistant:

MPP_RET init_picture(H264_SLICE_t *currSlice)
{
    MPP_RET ret = MPP_ERR_UNKNOW;
    H264_DecCtx_t *p_Dec   = currSlice->p_Vid->p_Dec;
    H264dVideoCtx_t *p_Vid = currSlice->p_Vid;
    H264dErrCtx_t *p_err   = &p_Dec->errctx;

    //!< discard stream before I_SLICE
    if (!p_err->i_slice_no && p_Vid->recovery.valid_flag && p_Vid->recovery.first_frm_valid &&
        p_Vid->recovery.first_frm_id == currSlice->frame_num) {
        p_err->i_slice_no += (!currSlice->layer_id) ? 1 : 0;
    } else {
        p_err->i_slice_no += ((!currSlice->layer_id) && (H264_I_SLICE == currSlice->slice_type)) ? 1 : 0;
    }

    if (!p_err->i_slice_no) {
        H264D_WARNNING("[Discard] Discard slice before I Slice. \n");
        ret = MPP_NOK;
        goto __FAILED;
    }
    FUN_CHECK(ret = alloc_decpic(currSlice));
    if (((p_err->i_slice_no < 2) && (!currSlice->layer_id) && (H264_I_SLICE == currSlice->slice_type)) ||
        currSlice->idr_flag) {
        p_err->first_iframe_poc = p_Vid->dec_pic->poc; //!< recoder first i frame poc
        p_err->first_iframe_is_output = 0;
    }
    //!< idr_memory_management MVC_layer, idr_flag==1
    if (currSlice->layer_id && !currSlice->svc_extension_flag && !currSlice->mvcExt.non_idr_flag) {
        ASSERT(currSlice->layer_id == 1);
        FUN_CHECK(ret = idr_memory_management(p_Vid->p_Dpb_layer[currSlice->layer_id], p_Vid->dec_pic));
    }

    // if cur pic i frame poc & frame_num <= last pic, flush dpb.
    if (p_Vid->last_pic != NULL && p_Vid->dec_pic->poc != 0) {
        if (p_Vid->last_pic->frame_num >= p_Vid->dec_pic->frame_num
            && p_Vid->last_pic->poc >= p_Vid->dec_pic->poc
            && p_Vid->dec_pic->slice_type == H264_I_SLICE
            && p_Vid->dec_pic->structure == 3) {
            if (currSlice->layer_id == 0) {
                FUN_CHECK(ret = flush_dpb(p_Vid->p_Dpb_layer[0], 1));
            } else {
                FUN_CHECK(ret = flush_dpb(p_Vid->p_Dpb_layer[1], 2));
            }
        }
    }
    update_ref_list(p_Vid->p_Dpb_layer[currSlice->layer_id]);
    update_ltref_list(p_Vid->p_Dpb_layer[currSlice->layer_id]);
    update_pic_num(currSlice);
    //!< reorder
    if (!currSlice->idr_flag || currSlice->layer_id) {
        FUN_CHECK(ret = init_lists_p_slice_mvc(currSlice));
        FUN_CHECK(ret = init_lists_b_slice_mvc(currSlice));
    }
    prepare_init_dpb_info(currSlice);
    prepare_init_ref_info(currSlice);

    FUN_CHECK(ret = check_refer_dpb_buf_slots(currSlice));
    check_refer_picture_lists(currSlice);
    {
        H264dDxvaCtx_t *dxva_ctx = p_Dec->dxva_ctx;

        fill_picparams(currSlice->p_Vid, &dxva_ctx->pp);
        if (dxva_ctx->pp.scaleing_list_enable_flag) {
            prepare_init_scanlist(currSlice);
            fill_scanlist(currSlice->p_Vid, &dxva_ctx->qm);
        }
    }

    return ret = MPP_OK;
__FAILED:
    return ret;
}